

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Primitive PVar14;
  int iVar15;
  Geometry *pGVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined8 uVar24;
  long lVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  byte bVar70;
  uint uVar71;
  ulong uVar72;
  long lVar73;
  Geometry *geometry;
  long lVar74;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  ulong uVar75;
  bool bVar76;
  ulong uVar77;
  byte bVar78;
  float fVar126;
  float fVar128;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar81 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar84 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar127;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar132;
  undefined4 uVar133;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar144;
  float fVar146;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined8 uVar140;
  float fVar145;
  undefined1 auVar143 [32];
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar160;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar163 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [16];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  RTCFilterFunctionNArguments args;
  int local_544;
  Ray *local_540;
  Primitive *local_538;
  ulong local_530;
  Precalculations *local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  RTCFilterFunctionNArguments local_510;
  undefined1 local_4e0 [16];
  undefined8 local_4d0;
  undefined4 local_4c8;
  float local_4c4;
  undefined4 local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  uint local_4b4;
  uint local_4b0;
  Geometry *local_498;
  RayQueryContext *local_490;
  ulong local_488;
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  int local_1fc;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar14 = prim[1];
  uVar75 = (ulong)(byte)PVar14;
  fVar160 = *(float *)(prim + uVar75 * 0x19 + 0x12);
  local_528 = pre;
  auVar85 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar75 * 0x19 + 6));
  fVar147 = fVar160 * auVar85._0_4_;
  fVar132 = fVar160 * (ray->dir).field_0.m128[0];
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar75 * 4 + 6);
  auVar92 = vpmovsxbd_avx2(auVar82);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar75 * 5 + 6);
  auVar89 = vpmovsxbd_avx2(auVar83);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar75 * 6 + 6);
  auVar90 = vpmovsxbd_avx2(auVar79);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar75 * 0xb + 6);
  auVar91 = vpmovsxbd_avx2(auVar10);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar14 * 0xc) + 6);
  auVar96 = vpmovsxbd_avx2(auVar184);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar94 = vcvtdq2ps_avx(auVar96);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (uint)(byte)PVar14 * 0xc + uVar75 + 6);
  auVar93 = vpmovsxbd_avx2(auVar11);
  auVar93 = vcvtdq2ps_avx(auVar93);
  uVar77 = (ulong)(uint)((int)(uVar75 * 9) * 2);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar77 + 6);
  auVar101 = vpmovsxbd_avx2(auVar12);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar77 + uVar75 + 6);
  auVar100 = vpmovsxbd_avx2(auVar13);
  auVar100 = vcvtdq2ps_avx(auVar100);
  uVar72 = (ulong)(uint)((int)(uVar75 * 5) << 2);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar72 + 6);
  auVar88 = vpmovsxbd_avx2(auVar80);
  auVar95 = vcvtdq2ps_avx(auVar88);
  auVar177._4_4_ = fVar132;
  auVar177._0_4_ = fVar132;
  auVar177._8_4_ = fVar132;
  auVar177._12_4_ = fVar132;
  auVar177._16_4_ = fVar132;
  auVar177._20_4_ = fVar132;
  auVar177._24_4_ = fVar132;
  auVar177._28_4_ = fVar132;
  auVar180._8_4_ = 1;
  auVar180._0_8_ = 0x100000001;
  auVar180._12_4_ = 1;
  auVar180._16_4_ = 1;
  auVar180._20_4_ = 1;
  auVar180._24_4_ = 1;
  auVar180._28_4_ = 1;
  auVar86 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar98 = ZEXT1632(CONCAT412(fVar160 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar160 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar160 * (ray->dir).field_0.m128[1],fVar132))));
  auVar97 = vpermps_avx2(auVar180,auVar98);
  auVar87 = vpermps_avx512vl(auVar86,auVar98);
  fVar132 = auVar87._0_4_;
  fVar144 = auVar87._4_4_;
  auVar98._4_4_ = fVar144 * auVar90._4_4_;
  auVar98._0_4_ = fVar132 * auVar90._0_4_;
  fVar145 = auVar87._8_4_;
  auVar98._8_4_ = fVar145 * auVar90._8_4_;
  fVar146 = auVar87._12_4_;
  auVar98._12_4_ = fVar146 * auVar90._12_4_;
  fVar164 = auVar87._16_4_;
  auVar98._16_4_ = fVar164 * auVar90._16_4_;
  fVar165 = auVar87._20_4_;
  auVar98._20_4_ = fVar165 * auVar90._20_4_;
  fVar166 = auVar87._24_4_;
  auVar98._24_4_ = fVar166 * auVar90._24_4_;
  auVar98._28_4_ = auVar96._28_4_;
  auVar96._4_4_ = auVar93._4_4_ * fVar144;
  auVar96._0_4_ = auVar93._0_4_ * fVar132;
  auVar96._8_4_ = auVar93._8_4_ * fVar145;
  auVar96._12_4_ = auVar93._12_4_ * fVar146;
  auVar96._16_4_ = auVar93._16_4_ * fVar164;
  auVar96._20_4_ = auVar93._20_4_ * fVar165;
  auVar96._24_4_ = auVar93._24_4_ * fVar166;
  auVar96._28_4_ = auVar88._28_4_;
  auVar88._4_4_ = auVar95._4_4_ * fVar144;
  auVar88._0_4_ = auVar95._0_4_ * fVar132;
  auVar88._8_4_ = auVar95._8_4_ * fVar145;
  auVar88._12_4_ = auVar95._12_4_ * fVar146;
  auVar88._16_4_ = auVar95._16_4_ * fVar164;
  auVar88._20_4_ = auVar95._20_4_ * fVar165;
  auVar88._24_4_ = auVar95._24_4_ * fVar166;
  auVar88._28_4_ = auVar87._28_4_;
  auVar82 = vfmadd231ps_fma(auVar98,auVar97,auVar89);
  auVar83 = vfmadd231ps_fma(auVar96,auVar97,auVar94);
  auVar79 = vfmadd231ps_fma(auVar88,auVar100,auVar97);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar177,auVar92);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar177,auVar91);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar101,auVar177);
  auVar178._4_4_ = fVar147;
  auVar178._0_4_ = fVar147;
  auVar178._8_4_ = fVar147;
  auVar178._12_4_ = fVar147;
  auVar178._16_4_ = fVar147;
  auVar178._20_4_ = fVar147;
  auVar178._24_4_ = fVar147;
  auVar178._28_4_ = fVar147;
  auVar88 = ZEXT1632(CONCAT412(fVar160 * auVar85._12_4_,
                               CONCAT48(fVar160 * auVar85._8_4_,
                                        CONCAT44(fVar160 * auVar85._4_4_,fVar147))));
  auVar96 = vpermps_avx2(auVar180,auVar88);
  auVar88 = vpermps_avx512vl(auVar86,auVar88);
  fVar160 = auVar88._0_4_;
  fVar132 = auVar88._4_4_;
  auVar97._4_4_ = fVar132 * auVar90._4_4_;
  auVar97._0_4_ = fVar160 * auVar90._0_4_;
  fVar144 = auVar88._8_4_;
  auVar97._8_4_ = fVar144 * auVar90._8_4_;
  fVar145 = auVar88._12_4_;
  auVar97._12_4_ = fVar145 * auVar90._12_4_;
  fVar146 = auVar88._16_4_;
  auVar97._16_4_ = fVar146 * auVar90._16_4_;
  fVar164 = auVar88._20_4_;
  auVar97._20_4_ = fVar164 * auVar90._20_4_;
  fVar165 = auVar88._24_4_;
  auVar97._24_4_ = fVar165 * auVar90._24_4_;
  auVar97._28_4_ = 1;
  auVar86._4_4_ = auVar93._4_4_ * fVar132;
  auVar86._0_4_ = auVar93._0_4_ * fVar160;
  auVar86._8_4_ = auVar93._8_4_ * fVar144;
  auVar86._12_4_ = auVar93._12_4_ * fVar145;
  auVar86._16_4_ = auVar93._16_4_ * fVar146;
  auVar86._20_4_ = auVar93._20_4_ * fVar164;
  auVar86._24_4_ = auVar93._24_4_ * fVar165;
  auVar86._28_4_ = auVar90._28_4_;
  auVar93._4_4_ = auVar95._4_4_ * fVar132;
  auVar93._0_4_ = auVar95._0_4_ * fVar160;
  auVar93._8_4_ = auVar95._8_4_ * fVar144;
  auVar93._12_4_ = auVar95._12_4_ * fVar145;
  auVar93._16_4_ = auVar95._16_4_ * fVar146;
  auVar93._20_4_ = auVar95._20_4_ * fVar164;
  auVar93._24_4_ = auVar95._24_4_ * fVar165;
  auVar93._28_4_ = auVar88._28_4_;
  auVar10 = vfmadd231ps_fma(auVar97,auVar96,auVar89);
  auVar184 = vfmadd231ps_fma(auVar86,auVar96,auVar94);
  auVar11 = vfmadd231ps_fma(auVar93,auVar96,auVar100);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar178,auVar92);
  auVar184 = vfmadd231ps_fma(ZEXT1632(auVar184),auVar178,auVar91);
  auVar169._8_4_ = 0x7fffffff;
  auVar169._0_8_ = 0x7fffffff7fffffff;
  auVar169._12_4_ = 0x7fffffff;
  auVar169._16_4_ = 0x7fffffff;
  auVar169._20_4_ = 0x7fffffff;
  auVar169._24_4_ = 0x7fffffff;
  auVar169._28_4_ = 0x7fffffff;
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar178,auVar101);
  auVar92 = vandps_avx(ZEXT1632(auVar82),auVar169);
  auVar163._8_4_ = 0x219392ef;
  auVar163._0_8_ = 0x219392ef219392ef;
  auVar163._12_4_ = 0x219392ef;
  auVar163._16_4_ = 0x219392ef;
  auVar163._20_4_ = 0x219392ef;
  auVar163._24_4_ = 0x219392ef;
  auVar163._28_4_ = 0x219392ef;
  uVar77 = vcmpps_avx512vl(auVar92,auVar163,1);
  bVar76 = (bool)((byte)uVar77 & 1);
  auVar87._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar82._0_4_;
  bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar82._4_4_;
  bVar76 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar82._8_4_;
  bVar76 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar82._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  auVar92 = vandps_avx(ZEXT1632(auVar83),auVar169);
  uVar77 = vcmpps_avx512vl(auVar92,auVar163,1);
  bVar76 = (bool)((byte)uVar77 & 1);
  auVar99._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar83._0_4_;
  bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar83._4_4_;
  bVar76 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar83._8_4_;
  bVar76 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar83._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  auVar92 = vandps_avx(ZEXT1632(auVar79),auVar169);
  uVar77 = vcmpps_avx512vl(auVar92,auVar163,1);
  bVar76 = (bool)((byte)uVar77 & 1);
  auVar92._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar79._0_4_;
  bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar79._4_4_;
  bVar76 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar79._8_4_;
  bVar76 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar79._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  auVar89 = vrcp14ps_avx512vl(auVar87);
  auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar91 = vfnmadd213ps_avx512vl(auVar87,auVar89,auVar90);
  auVar82 = vfmadd132ps_fma(auVar91,auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar99);
  auVar91 = vfnmadd213ps_avx512vl(auVar99,auVar89,auVar90);
  auVar83 = vfmadd132ps_fma(auVar91,auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar92);
  auVar92 = vfnmadd213ps_avx512vl(auVar92,auVar89,auVar90);
  auVar79 = vfmadd132ps_fma(auVar92,auVar89,auVar89);
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 7 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar10));
  auVar101._4_4_ = auVar82._4_4_ * auVar92._4_4_;
  auVar101._0_4_ = auVar82._0_4_ * auVar92._0_4_;
  auVar101._8_4_ = auVar82._8_4_ * auVar92._8_4_;
  auVar101._12_4_ = auVar82._12_4_ * auVar92._12_4_;
  auVar101._16_4_ = auVar92._16_4_ * 0.0;
  auVar101._20_4_ = auVar92._20_4_ * 0.0;
  auVar101._24_4_ = auVar92._24_4_ * 0.0;
  auVar101._28_4_ = auVar92._28_4_;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 9 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar10));
  auVar93 = vpbroadcastd_avx512vl();
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar14 * 0x10 + 6));
  auVar143._0_4_ = auVar82._0_4_ * auVar92._0_4_;
  auVar143._4_4_ = auVar82._4_4_ * auVar92._4_4_;
  auVar143._8_4_ = auVar82._8_4_ * auVar92._8_4_;
  auVar143._12_4_ = auVar82._12_4_ * auVar92._12_4_;
  auVar143._16_4_ = auVar92._16_4_ * 0.0;
  auVar143._20_4_ = auVar92._20_4_ * 0.0;
  auVar143._24_4_ = auVar92._24_4_ * 0.0;
  auVar143._28_4_ = 0;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar14 * 0x10 + uVar75 * -2 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar184));
  auVar100._4_4_ = auVar83._4_4_ * auVar92._4_4_;
  auVar100._0_4_ = auVar83._0_4_ * auVar92._0_4_;
  auVar100._8_4_ = auVar83._8_4_ * auVar92._8_4_;
  auVar100._12_4_ = auVar83._12_4_ * auVar92._12_4_;
  auVar100._16_4_ = auVar92._16_4_ * 0.0;
  auVar100._20_4_ = auVar92._20_4_ * 0.0;
  auVar100._24_4_ = auVar92._24_4_ * 0.0;
  auVar100._28_4_ = auVar92._28_4_;
  auVar92 = vcvtdq2ps_avx(auVar89);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar184));
  auVar137._0_4_ = auVar83._0_4_ * auVar92._0_4_;
  auVar137._4_4_ = auVar83._4_4_ * auVar92._4_4_;
  auVar137._8_4_ = auVar83._8_4_ * auVar92._8_4_;
  auVar137._12_4_ = auVar83._12_4_ * auVar92._12_4_;
  auVar137._16_4_ = auVar92._16_4_ * 0.0;
  auVar137._20_4_ = auVar92._20_4_ * 0.0;
  auVar137._24_4_ = auVar92._24_4_ * 0.0;
  auVar137._28_4_ = 0;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 + uVar75 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar11));
  auVar95._4_4_ = auVar92._4_4_ * auVar79._4_4_;
  auVar95._0_4_ = auVar92._0_4_ * auVar79._0_4_;
  auVar95._8_4_ = auVar92._8_4_ * auVar79._8_4_;
  auVar95._12_4_ = auVar92._12_4_ * auVar79._12_4_;
  auVar95._16_4_ = auVar92._16_4_ * 0.0;
  auVar95._20_4_ = auVar92._20_4_ * 0.0;
  auVar95._24_4_ = auVar92._24_4_ * 0.0;
  auVar95._28_4_ = auVar92._28_4_;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 0x17 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar11));
  auVar134._0_4_ = auVar79._0_4_ * auVar92._0_4_;
  auVar134._4_4_ = auVar79._4_4_ * auVar92._4_4_;
  auVar134._8_4_ = auVar79._8_4_ * auVar92._8_4_;
  auVar134._12_4_ = auVar79._12_4_ * auVar92._12_4_;
  auVar134._16_4_ = auVar92._16_4_ * 0.0;
  auVar134._20_4_ = auVar92._20_4_ * 0.0;
  auVar134._24_4_ = auVar92._24_4_ * 0.0;
  auVar134._28_4_ = 0;
  auVar92 = vpminsd_avx2(auVar101,auVar143);
  auVar89 = vpminsd_avx2(auVar100,auVar137);
  auVar92 = vmaxps_avx(auVar92,auVar89);
  auVar89 = vpminsd_avx2(auVar95,auVar134);
  uVar133 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar90._4_4_ = uVar133;
  auVar90._0_4_ = uVar133;
  auVar90._8_4_ = uVar133;
  auVar90._12_4_ = uVar133;
  auVar90._16_4_ = uVar133;
  auVar90._20_4_ = uVar133;
  auVar90._24_4_ = uVar133;
  auVar90._28_4_ = uVar133;
  auVar89 = vmaxps_avx512vl(auVar89,auVar90);
  auVar92 = vmaxps_avx(auVar92,auVar89);
  auVar89._8_4_ = 0x3f7ffffa;
  auVar89._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar89._12_4_ = 0x3f7ffffa;
  auVar89._16_4_ = 0x3f7ffffa;
  auVar89._20_4_ = 0x3f7ffffa;
  auVar89._24_4_ = 0x3f7ffffa;
  auVar89._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar92,auVar89);
  auVar92 = vpmaxsd_avx2(auVar101,auVar143);
  auVar89 = vpmaxsd_avx2(auVar100,auVar137);
  auVar92 = vminps_avx(auVar92,auVar89);
  auVar89 = vpmaxsd_avx2(auVar95,auVar134);
  fVar160 = ray->tfar;
  auVar91._4_4_ = fVar160;
  auVar91._0_4_ = fVar160;
  auVar91._8_4_ = fVar160;
  auVar91._12_4_ = fVar160;
  auVar91._16_4_ = fVar160;
  auVar91._20_4_ = fVar160;
  auVar91._24_4_ = fVar160;
  auVar91._28_4_ = fVar160;
  auVar89 = vminps_avx512vl(auVar89,auVar91);
  auVar92 = vminps_avx(auVar92,auVar89);
  auVar94._8_4_ = 0x3f800003;
  auVar94._0_8_ = 0x3f8000033f800003;
  auVar94._12_4_ = 0x3f800003;
  auVar94._16_4_ = 0x3f800003;
  auVar94._20_4_ = 0x3f800003;
  auVar94._24_4_ = 0x3f800003;
  auVar94._28_4_ = 0x3f800003;
  auVar92 = vmulps_avx512vl(auVar92,auVar94);
  uVar24 = vpcmpgtd_avx512vl(auVar93,_DAT_01fe9900);
  uVar140 = vcmpps_avx512vl(local_80,auVar92,2);
  if ((byte)((byte)uVar140 & (byte)uVar24) == 0) {
    bVar76 = false;
  }
  else {
    uVar77 = (ulong)(byte)((byte)uVar140 & (byte)uVar24);
    local_540 = ray;
    local_538 = prim;
    do {
      lVar25 = 0;
      for (uVar72 = uVar77; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      local_530 = (ulong)*(uint *)(local_538 + 2);
      pGVar16 = (context->scene->geometries).items[*(uint *)(local_538 + 2)].ptr;
      local_488 = (ulong)*(uint *)(local_538 + lVar25 * 4 + 6);
      uVar72 = (ulong)*(uint *)(*(long *)&pGVar16->field_0x58 +
                               pGVar16[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               (ulong)*(uint *)(local_538 + lVar25 * 4 + 6));
      p_Var17 = pGVar16[1].intersectionFilterN;
      lVar25 = *(long *)&pGVar16[1].time_range.upper;
      local_470 = *(undefined1 (*) [16])(lVar25 + (long)p_Var17 * uVar72);
      local_480 = *(undefined1 (*) [16])(lVar25 + (uVar72 + 1) * (long)p_Var17);
      pauVar3 = (undefined1 (*) [16])(lVar25 + (uVar72 + 2) * (long)p_Var17);
      auVar82 = *pauVar3;
      local_520 = *(undefined8 *)*pauVar3;
      uStack_518 = *(undefined8 *)(*pauVar3 + 8);
      uVar77 = uVar77 - 1 & uVar77;
      pauVar4 = (undefined1 (*) [12])(lVar25 + (uVar72 + 3) * (long)p_Var17);
      local_450 = (float)*(undefined8 *)*pauVar4;
      fStack_44c = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
      fStack_448 = (float)*(undefined8 *)(*pauVar4 + 8);
      fStack_444 = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
      if (uVar77 != 0) {
        uVar75 = uVar77 - 1 & uVar77;
        for (uVar72 = uVar77; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
        }
        if (uVar75 != 0) {
          for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar15 = (int)pGVar16[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar5 = (local_540->org).field_0;
      auVar79 = vsubps_avx512vl(local_470,(undefined1  [16])aVar5);
      uVar133 = auVar79._0_4_;
      auVar81._4_4_ = uVar133;
      auVar81._0_4_ = uVar133;
      auVar81._8_4_ = uVar133;
      auVar81._12_4_ = uVar133;
      auVar83 = vshufps_avx(auVar79,auVar79,0x55);
      auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
      aVar6 = (local_528->ray_space).vx.field_0;
      aVar7 = (local_528->ray_space).vy.field_0;
      fVar160 = (local_528->ray_space).vz.field_0.m128[0];
      fVar132 = (local_528->ray_space).vz.field_0.m128[1];
      fVar144 = (local_528->ray_space).vz.field_0.m128[2];
      fVar145 = (local_528->ray_space).vz.field_0.m128[3];
      auVar171._0_4_ = auVar79._0_4_ * fVar160;
      auVar171._4_4_ = auVar79._4_4_ * fVar132;
      auVar171._8_4_ = auVar79._8_4_ * fVar144;
      auVar171._12_4_ = auVar79._12_4_ * fVar145;
      auVar83 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar7,auVar83);
      auVar184 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar6,auVar81);
      auVar80 = vshufps_avx512vl(local_470,local_470,0xff);
      auVar79 = vsubps_avx(local_480,(undefined1  [16])aVar5);
      uVar133 = auVar79._0_4_;
      auVar84._4_4_ = uVar133;
      auVar84._0_4_ = uVar133;
      auVar84._8_4_ = uVar133;
      auVar84._12_4_ = uVar133;
      auVar83 = vshufps_avx(auVar79,auVar79,0x55);
      auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
      auVar172._0_4_ = auVar79._0_4_ * fVar160;
      auVar172._4_4_ = auVar79._4_4_ * fVar132;
      auVar172._8_4_ = auVar79._8_4_ * fVar144;
      auVar172._12_4_ = auVar79._12_4_ * fVar145;
      auVar83 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar7,auVar83);
      auVar11 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar6,auVar84);
      auVar83 = vshufps_avx(local_480,local_480,0xff);
      auVar10 = vsubps_avx(auVar82,(undefined1  [16])aVar5);
      uVar133 = auVar10._0_4_;
      auVar161._4_4_ = uVar133;
      auVar161._0_4_ = uVar133;
      auVar161._8_4_ = uVar133;
      auVar161._12_4_ = uVar133;
      auVar79 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar174._0_4_ = auVar10._0_4_ * fVar160;
      auVar174._4_4_ = auVar10._4_4_ * fVar132;
      auVar174._8_4_ = auVar10._8_4_ * fVar144;
      auVar174._12_4_ = auVar10._12_4_ * fVar145;
      auVar79 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar7,auVar79);
      auVar10 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar6,auVar161);
      auVar81 = vshufps_avx512vl(auVar82,auVar82,0xff);
      auVar85._12_4_ = fStack_444;
      auVar85._0_12_ = *pauVar4;
      local_2e0 = ZEXT1632((undefined1  [16])aVar5);
      auVar79 = vsubps_avx(auVar85,(undefined1  [16])aVar5);
      uVar133 = auVar79._0_4_;
      auVar162._4_4_ = uVar133;
      auVar162._0_4_ = uVar133;
      auVar162._8_4_ = uVar133;
      auVar162._12_4_ = uVar133;
      auVar82 = vshufps_avx(auVar79,auVar79,0x55);
      auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
      auVar175._0_4_ = auVar79._0_4_ * fVar160;
      auVar175._4_4_ = auVar79._4_4_ * fVar132;
      auVar175._8_4_ = auVar79._8_4_ * fVar144;
      auVar175._12_4_ = auVar79._12_4_ * fVar145;
      auVar82 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar7,auVar82);
      auVar79 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar6,auVar162);
      lVar25 = (long)iVar15 * 0x44;
      auVar92 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25);
      uVar133 = auVar184._0_4_;
      local_360._4_4_ = uVar133;
      local_360._0_4_ = uVar133;
      local_360._8_4_ = uVar133;
      local_360._12_4_ = uVar133;
      local_360._16_4_ = uVar133;
      local_360._20_4_ = uVar133;
      local_360._24_4_ = uVar133;
      local_360._28_4_ = uVar133;
      auVar135._8_4_ = 1;
      auVar135._0_8_ = 0x100000001;
      auVar135._12_4_ = 1;
      auVar135._16_4_ = 1;
      auVar135._20_4_ = 1;
      auVar135._24_4_ = 1;
      auVar135._28_4_ = 1;
      local_380 = vpermps_avx2(auVar135,ZEXT1632(auVar184));
      auVar89 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x484);
      local_3e0 = vbroadcastss_avx512vl(auVar11);
      local_3a0 = vpermps_avx512vl(auVar135,ZEXT1632(auVar11));
      auVar90 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x908);
      local_400 = vbroadcastss_avx512vl(auVar10);
      local_420 = vpermps_avx512vl(auVar135,ZEXT1632(auVar10));
      auVar91 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0xd8c);
      uVar133 = auVar79._0_4_;
      local_3c0._4_4_ = uVar133;
      local_3c0._0_4_ = uVar133;
      local_3c0._8_4_ = uVar133;
      local_3c0._12_4_ = uVar133;
      local_3c0._16_4_ = uVar133;
      local_3c0._20_4_ = uVar133;
      local_3c0._24_4_ = uVar133;
      local_3c0._28_4_ = uVar133;
      local_440 = vpermps_avx512vl(auVar135,ZEXT1632(auVar79));
      auVar94 = vmulps_avx512vl(local_3c0,auVar91);
      auVar93 = vmulps_avx512vl(local_440,auVar91);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,local_400);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar90,local_420);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,local_3e0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,local_3a0);
      auVar95 = vfmadd231ps_avx512vl(auVar94,auVar92,local_360);
      auVar96 = vfmadd231ps_avx512vl(auVar93,auVar92,local_380);
      auVar94 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25);
      auVar93 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x484);
      auVar101 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x908);
      auVar100 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0xd8c);
      auVar88 = vmulps_avx512vl(local_3c0,auVar100);
      auVar97 = vmulps_avx512vl(local_440,auVar100);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar101,local_400);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar101,local_420);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar93,local_3e0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,local_3a0);
      auVar12 = vfmadd231ps_fma(auVar88,auVar94,local_360);
      auVar13 = vfmadd231ps_fma(auVar97,auVar94,local_380);
      auVar88 = vsubps_avx512vl(ZEXT1632(auVar12),auVar95);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar13),auVar96);
      auVar98 = vmulps_avx512vl(auVar96,auVar88);
      auVar86 = vmulps_avx512vl(auVar95,auVar97);
      auVar98 = vsubps_avx512vl(auVar98,auVar86);
      auVar82 = vshufps_avx512vl(auVar85,auVar85,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar80);
      uVar140 = auVar83._0_8_;
      local_c0._8_8_ = uVar140;
      local_c0._0_8_ = uVar140;
      local_c0._16_8_ = uVar140;
      local_c0._24_8_ = uVar140;
      local_e0 = vbroadcastsd_avx512vl(auVar81);
      _local_100 = vbroadcastsd_avx512vl(auVar82);
      auVar86 = vmulps_avx512vl(_local_100,auVar91);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar90,local_e0);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar89,local_c0);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar92,local_a0);
      auVar87 = vmulps_avx512vl(_local_100,auVar100);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar101,local_e0);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar93,local_c0);
      auVar80 = vfmadd231ps_fma(auVar87,auVar94,local_a0);
      auVar87 = vmulps_avx512vl(auVar97,auVar97);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar88,auVar88);
      auVar99 = vmaxps_avx512vl(auVar86,ZEXT1632(auVar80));
      auVar99 = vmulps_avx512vl(auVar99,auVar99);
      auVar87 = vmulps_avx512vl(auVar99,auVar87);
      auVar98 = vmulps_avx512vl(auVar98,auVar98);
      uVar140 = vcmpps_avx512vl(auVar98,auVar87,2);
      auVar82 = vblendps_avx(auVar184,local_470,8);
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar83 = vandps_avx512vl(auVar82,auVar81);
      auVar82 = vblendps_avx(auVar11,local_480,8);
      auVar82 = vandps_avx512vl(auVar82,auVar81);
      auVar83 = vmaxps_avx(auVar83,auVar82);
      auVar82 = vblendps_avx(auVar10,*pauVar3,8);
      auVar84 = vandps_avx512vl(auVar82,auVar81);
      auVar82 = vblendps_avx(auVar79,auVar85,8);
      auVar82 = vandps_avx512vl(auVar82,auVar81);
      auVar82 = vmaxps_avx(auVar84,auVar82);
      auVar82 = vmaxps_avx(auVar83,auVar82);
      auVar83 = vmovshdup_avx(auVar82);
      auVar83 = vmaxss_avx(auVar83,auVar82);
      auVar82 = vshufpd_avx(auVar82,auVar82,1);
      auVar82 = vmaxss_avx(auVar82,auVar83);
      _local_300 = vcvtsi2ss_avx512f(local_470,iVar15);
      auVar176._0_4_ = local_300._0_4_;
      auVar176._4_4_ = auVar176._0_4_;
      auVar176._8_4_ = auVar176._0_4_;
      auVar176._12_4_ = auVar176._0_4_;
      auVar176._16_4_ = auVar176._0_4_;
      auVar176._20_4_ = auVar176._0_4_;
      auVar176._24_4_ = auVar176._0_4_;
      auVar176._28_4_ = auVar176._0_4_;
      uVar24 = vcmpps_avx512vl(auVar176,_DAT_01faff40,0xe);
      bVar78 = (byte)uVar140 & (byte)uVar24;
      auVar82 = vmulss_avx512f(auVar82,ZEXT416(0x35000000));
      auVar152._8_4_ = 2;
      auVar152._0_8_ = 0x200000002;
      auVar152._12_4_ = 2;
      auVar152._16_4_ = 2;
      auVar152._20_4_ = 2;
      auVar152._24_4_ = 2;
      auVar152._28_4_ = 2;
      local_320 = vpermps_avx2(auVar152,ZEXT1632(auVar184));
      local_340 = vpermps_avx2(auVar152,ZEXT1632(auVar11));
      local_120 = vpermps_avx512vl(auVar152,ZEXT1632(auVar10));
      local_140 = vpermps_avx512vl(auVar152,ZEXT1632(auVar79));
      if (bVar78 == 0) {
        bVar76 = false;
        auVar83 = vxorps_avx512vl(auVar101._0_16_,auVar101._0_16_);
        auVar185 = ZEXT1664(auVar83);
        auVar179 = ZEXT3264(local_360);
        auVar183 = ZEXT3264(local_380);
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar186 = ZEXT3264(auVar92);
        auVar189 = ZEXT3264(local_3e0);
        auVar191 = ZEXT3264(local_3a0);
        auVar187 = ZEXT3264(local_400);
        auVar190 = ZEXT3264(local_420);
        auVar188 = ZEXT3264(local_3c0);
        auVar192 = ZEXT3264(local_440);
      }
      else {
        auVar100 = vmulps_avx512vl(local_140,auVar100);
        auVar101 = vfmadd213ps_avx512vl(auVar101,local_120,auVar100);
        auVar93 = vfmadd213ps_avx512vl(auVar93,local_340,auVar101);
        auVar93 = vfmadd213ps_avx512vl(auVar94,local_320,auVar93);
        auVar91 = vmulps_avx512vl(local_140,auVar91);
        auVar90 = vfmadd213ps_avx512vl(auVar90,local_120,auVar91);
        auVar83 = vfmadd213ps_fma(auVar89,local_340,auVar90);
        auVar89 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1210);
        auVar90 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1694);
        auVar91 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1b18);
        auVar94 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1f9c);
        auVar101 = vfmadd213ps_avx512vl(auVar92,local_320,ZEXT1632(auVar83));
        auVar92 = vmulps_avx512vl(local_3c0,auVar94);
        auVar192 = ZEXT3264(local_440);
        auVar100 = vmulps_avx512vl(local_440,auVar94);
        auVar94 = vmulps_avx512vl(local_140,auVar94);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar91,local_400);
        auVar83 = vfmadd231ps_fma(auVar100,auVar91,local_420);
        auVar91 = vfmadd231ps_avx512vl(auVar94,local_120,auVar91);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar90,local_3e0);
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar90,local_3a0);
        auVar100 = vfmadd231ps_avx512vl(auVar91,local_340,auVar90);
        auVar98 = vfmadd231ps_avx512vl(auVar92,auVar89,local_360);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,local_380);
        auVar92 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1210);
        auVar90 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1b18);
        auVar91 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1f9c);
        auVar83 = vfmadd231ps_fma(auVar100,local_320,auVar89);
        auVar89 = vmulps_avx512vl(local_3c0,auVar91);
        auVar100 = vmulps_avx512vl(local_440,auVar91);
        auVar91 = vmulps_avx512vl(local_140,auVar91);
        auVar87 = vfmadd231ps_avx512vl(auVar89,auVar90,local_400);
        auVar79 = vfmadd231ps_fma(auVar100,auVar90,local_420);
        auVar90 = vfmadd231ps_avx512vl(auVar91,local_120,auVar90);
        auVar89 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1694);
        auVar91 = vfmadd231ps_avx512vl(auVar87,auVar89,local_3e0);
        auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar89,local_3a0);
        auVar89 = vfmadd231ps_avx512vl(auVar90,local_340,auVar89);
        auVar90 = vfmadd231ps_avx512vl(auVar91,auVar92,local_360);
        auVar91 = vfmadd231ps_avx512vl(auVar100,auVar92,local_380);
        auVar79 = vfmadd231ps_fma(auVar89,local_320,auVar92);
        auVar181._8_4_ = 0x7fffffff;
        auVar181._0_8_ = 0x7fffffff7fffffff;
        auVar181._12_4_ = 0x7fffffff;
        auVar181._16_4_ = 0x7fffffff;
        auVar181._20_4_ = 0x7fffffff;
        auVar181._24_4_ = 0x7fffffff;
        auVar181._28_4_ = 0x7fffffff;
        auVar92 = vandps_avx(auVar98,auVar181);
        auVar89 = vandps_avx(auVar94,auVar181);
        auVar89 = vmaxps_avx(auVar92,auVar89);
        auVar92 = vandps_avx(ZEXT1632(auVar83),auVar181);
        auVar92 = vmaxps_avx(auVar89,auVar92);
        auVar100 = vbroadcastss_avx512vl(auVar82);
        uVar72 = vcmpps_avx512vl(auVar92,auVar100,1);
        bVar76 = (bool)((byte)uVar72 & 1);
        auVar102._0_4_ = (float)((uint)bVar76 * auVar88._0_4_ | (uint)!bVar76 * auVar98._0_4_);
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar76 * auVar88._4_4_ | (uint)!bVar76 * auVar98._4_4_);
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar76 * auVar88._8_4_ | (uint)!bVar76 * auVar98._8_4_);
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar76 * auVar88._12_4_ | (uint)!bVar76 * auVar98._12_4_);
        bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar102._16_4_ = (float)((uint)bVar76 * auVar88._16_4_ | (uint)!bVar76 * auVar98._16_4_);
        bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar102._20_4_ = (float)((uint)bVar76 * auVar88._20_4_ | (uint)!bVar76 * auVar98._20_4_);
        bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar102._24_4_ = (float)((uint)bVar76 * auVar88._24_4_ | (uint)!bVar76 * auVar98._24_4_);
        bVar76 = SUB81(uVar72 >> 7,0);
        auVar102._28_4_ = (uint)bVar76 * auVar88._28_4_ | (uint)!bVar76 * auVar98._28_4_;
        bVar76 = (bool)((byte)uVar72 & 1);
        auVar103._0_4_ = (float)((uint)bVar76 * auVar97._0_4_ | (uint)!bVar76 * auVar94._0_4_);
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar76 * auVar97._4_4_ | (uint)!bVar76 * auVar94._4_4_);
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar76 * auVar97._8_4_ | (uint)!bVar76 * auVar94._8_4_);
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar76 * auVar97._12_4_ | (uint)!bVar76 * auVar94._12_4_);
        bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar103._16_4_ = (float)((uint)bVar76 * auVar97._16_4_ | (uint)!bVar76 * auVar94._16_4_);
        bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar103._20_4_ = (float)((uint)bVar76 * auVar97._20_4_ | (uint)!bVar76 * auVar94._20_4_);
        bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar103._24_4_ = (float)((uint)bVar76 * auVar97._24_4_ | (uint)!bVar76 * auVar94._24_4_);
        bVar76 = SUB81(uVar72 >> 7,0);
        auVar103._28_4_ = (uint)bVar76 * auVar97._28_4_ | (uint)!bVar76 * auVar94._28_4_;
        auVar92 = vandps_avx(auVar181,auVar90);
        auVar89 = vandps_avx(auVar91,auVar181);
        auVar89 = vmaxps_avx(auVar92,auVar89);
        auVar92 = vandps_avx(ZEXT1632(auVar79),auVar181);
        auVar92 = vmaxps_avx(auVar89,auVar92);
        uVar72 = vcmpps_avx512vl(auVar92,auVar100,1);
        bVar76 = (bool)((byte)uVar72 & 1);
        auVar104._0_4_ = (float)((uint)bVar76 * auVar88._0_4_ | (uint)!bVar76 * auVar90._0_4_);
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar76 * auVar88._4_4_ | (uint)!bVar76 * auVar90._4_4_);
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar76 * auVar88._8_4_ | (uint)!bVar76 * auVar90._8_4_);
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar76 * auVar88._12_4_ | (uint)!bVar76 * auVar90._12_4_);
        bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar104._16_4_ = (float)((uint)bVar76 * auVar88._16_4_ | (uint)!bVar76 * auVar90._16_4_);
        bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar104._20_4_ = (float)((uint)bVar76 * auVar88._20_4_ | (uint)!bVar76 * auVar90._20_4_);
        bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar104._24_4_ = (float)((uint)bVar76 * auVar88._24_4_ | (uint)!bVar76 * auVar90._24_4_);
        bVar76 = SUB81(uVar72 >> 7,0);
        auVar104._28_4_ = (uint)bVar76 * auVar88._28_4_ | (uint)!bVar76 * auVar90._28_4_;
        bVar76 = (bool)((byte)uVar72 & 1);
        auVar105._0_4_ = (float)((uint)bVar76 * auVar97._0_4_ | (uint)!bVar76 * auVar91._0_4_);
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar76 * auVar97._4_4_ | (uint)!bVar76 * auVar91._4_4_);
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar76 * auVar97._8_4_ | (uint)!bVar76 * auVar91._8_4_);
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar76 * auVar97._12_4_ | (uint)!bVar76 * auVar91._12_4_);
        bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar105._16_4_ = (float)((uint)bVar76 * auVar97._16_4_ | (uint)!bVar76 * auVar91._16_4_);
        bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar105._20_4_ = (float)((uint)bVar76 * auVar97._20_4_ | (uint)!bVar76 * auVar91._20_4_);
        bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar105._24_4_ = (float)((uint)bVar76 * auVar97._24_4_ | (uint)!bVar76 * auVar91._24_4_);
        bVar76 = SUB81(uVar72 >> 7,0);
        auVar105._28_4_ = (uint)bVar76 * auVar97._28_4_ | (uint)!bVar76 * auVar91._28_4_;
        auVar85 = vxorps_avx512vl(auVar82,auVar82);
        auVar185 = ZEXT1664(auVar85);
        auVar92 = vfmadd213ps_avx512vl(auVar102,auVar102,ZEXT1632(auVar85));
        auVar83 = vfmadd231ps_fma(auVar92,auVar103,auVar103);
        auVar92 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
        fVar160 = auVar92._0_4_;
        fVar132 = auVar92._4_4_;
        fVar144 = auVar92._8_4_;
        fVar145 = auVar92._12_4_;
        fVar146 = auVar92._16_4_;
        fVar164 = auVar92._20_4_;
        fVar165 = auVar92._24_4_;
        auVar33._4_4_ = fVar132 * fVar132 * fVar132 * auVar83._4_4_ * -0.5;
        auVar33._0_4_ = fVar160 * fVar160 * fVar160 * auVar83._0_4_ * -0.5;
        auVar33._8_4_ = fVar144 * fVar144 * fVar144 * auVar83._8_4_ * -0.5;
        auVar33._12_4_ = fVar145 * fVar145 * fVar145 * auVar83._12_4_ * -0.5;
        auVar33._16_4_ = fVar146 * fVar146 * fVar146 * -0.0;
        auVar33._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
        auVar33._24_4_ = fVar165 * fVar165 * fVar165 * -0.0;
        auVar33._28_4_ = 0;
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar90 = vfmadd231ps_avx512vl(auVar33,auVar89,auVar92);
        auVar34._4_4_ = auVar103._4_4_ * auVar90._4_4_;
        auVar34._0_4_ = auVar103._0_4_ * auVar90._0_4_;
        auVar34._8_4_ = auVar103._8_4_ * auVar90._8_4_;
        auVar34._12_4_ = auVar103._12_4_ * auVar90._12_4_;
        auVar34._16_4_ = auVar103._16_4_ * auVar90._16_4_;
        auVar34._20_4_ = auVar103._20_4_ * auVar90._20_4_;
        auVar34._24_4_ = auVar103._24_4_ * auVar90._24_4_;
        auVar34._28_4_ = auVar92._28_4_;
        auVar35._4_4_ = auVar90._4_4_ * -auVar102._4_4_;
        auVar35._0_4_ = auVar90._0_4_ * -auVar102._0_4_;
        auVar35._8_4_ = auVar90._8_4_ * -auVar102._8_4_;
        auVar35._12_4_ = auVar90._12_4_ * -auVar102._12_4_;
        auVar35._16_4_ = auVar90._16_4_ * -auVar102._16_4_;
        auVar35._20_4_ = auVar90._20_4_ * -auVar102._20_4_;
        auVar35._24_4_ = auVar90._24_4_ * -auVar102._24_4_;
        auVar35._28_4_ = auVar102._28_4_ ^ 0x80000000;
        auVar92 = vmulps_avx512vl(auVar90,ZEXT1632(auVar85));
        auVar97 = ZEXT1632(auVar85);
        auVar91 = vfmadd213ps_avx512vl(auVar104,auVar104,auVar97);
        auVar83 = vfmadd231ps_fma(auVar91,auVar105,auVar105);
        auVar91 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
        fVar160 = auVar91._0_4_;
        fVar132 = auVar91._4_4_;
        fVar144 = auVar91._8_4_;
        fVar145 = auVar91._12_4_;
        fVar146 = auVar91._16_4_;
        fVar164 = auVar91._20_4_;
        fVar165 = auVar91._24_4_;
        auVar36._4_4_ = fVar132 * fVar132 * fVar132 * auVar83._4_4_ * -0.5;
        auVar36._0_4_ = fVar160 * fVar160 * fVar160 * auVar83._0_4_ * -0.5;
        auVar36._8_4_ = fVar144 * fVar144 * fVar144 * auVar83._8_4_ * -0.5;
        auVar36._12_4_ = fVar145 * fVar145 * fVar145 * auVar83._12_4_ * -0.5;
        auVar36._16_4_ = fVar146 * fVar146 * fVar146 * -0.0;
        auVar36._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
        auVar36._24_4_ = fVar165 * fVar165 * fVar165 * -0.0;
        auVar36._28_4_ = 0;
        auVar89 = vfmadd231ps_avx512vl(auVar36,auVar89,auVar91);
        auVar37._4_4_ = auVar105._4_4_ * auVar89._4_4_;
        auVar37._0_4_ = auVar105._0_4_ * auVar89._0_4_;
        auVar37._8_4_ = auVar105._8_4_ * auVar89._8_4_;
        auVar37._12_4_ = auVar105._12_4_ * auVar89._12_4_;
        auVar37._16_4_ = auVar105._16_4_ * auVar89._16_4_;
        auVar37._20_4_ = auVar105._20_4_ * auVar89._20_4_;
        auVar37._24_4_ = auVar105._24_4_ * auVar89._24_4_;
        auVar37._28_4_ = auVar91._28_4_;
        auVar38._4_4_ = -auVar104._4_4_ * auVar89._4_4_;
        auVar38._0_4_ = -auVar104._0_4_ * auVar89._0_4_;
        auVar38._8_4_ = -auVar104._8_4_ * auVar89._8_4_;
        auVar38._12_4_ = -auVar104._12_4_ * auVar89._12_4_;
        auVar38._16_4_ = -auVar104._16_4_ * auVar89._16_4_;
        auVar38._20_4_ = -auVar104._20_4_ * auVar89._20_4_;
        auVar38._24_4_ = -auVar104._24_4_ * auVar89._24_4_;
        auVar38._28_4_ = auVar90._28_4_;
        auVar89 = vmulps_avx512vl(auVar89,auVar97);
        auVar90 = vfmadd213ps_avx512vl(auVar34,auVar86,auVar95);
        auVar91 = vfmadd213ps_avx512vl(auVar35,auVar86,auVar96);
        auVar94 = vfmadd213ps_avx512vl(auVar92,auVar86,auVar101);
        auVar100 = vfmadd213ps_avx512vl(auVar37,ZEXT1632(auVar80),ZEXT1632(auVar12));
        auVar95 = vfnmadd213ps_avx512vl(auVar34,auVar86,auVar95);
        auVar88 = ZEXT1632(auVar80);
        auVar83 = vfmadd213ps_fma(auVar38,auVar88,ZEXT1632(auVar13));
        auVar96 = vfnmadd213ps_avx512vl(auVar35,auVar86,auVar96);
        auVar79 = vfmadd213ps_fma(auVar89,auVar88,auVar93);
        auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar86,auVar92);
        auVar11 = vfnmadd213ps_fma(auVar37,auVar88,ZEXT1632(auVar12));
        auVar12 = vfnmadd213ps_fma(auVar38,auVar88,ZEXT1632(auVar13));
        auVar13 = vfnmadd231ps_fma(auVar93,ZEXT1632(auVar80),auVar89);
        auVar89 = vsubps_avx512vl(auVar100,auVar95);
        auVar92 = vsubps_avx(ZEXT1632(auVar83),auVar96);
        auVar93 = vsubps_avx512vl(ZEXT1632(auVar79),auVar101);
        auVar88 = vmulps_avx512vl(auVar92,auVar101);
        auVar10 = vfmsub231ps_fma(auVar88,auVar96,auVar93);
        auVar39._4_4_ = auVar95._4_4_ * auVar93._4_4_;
        auVar39._0_4_ = auVar95._0_4_ * auVar93._0_4_;
        auVar39._8_4_ = auVar95._8_4_ * auVar93._8_4_;
        auVar39._12_4_ = auVar95._12_4_ * auVar93._12_4_;
        auVar39._16_4_ = auVar95._16_4_ * auVar93._16_4_;
        auVar39._20_4_ = auVar95._20_4_ * auVar93._20_4_;
        auVar39._24_4_ = auVar95._24_4_ * auVar93._24_4_;
        auVar39._28_4_ = auVar93._28_4_;
        auVar93 = vfmsub231ps_avx512vl(auVar39,auVar101,auVar89);
        auVar40._4_4_ = auVar96._4_4_ * auVar89._4_4_;
        auVar40._0_4_ = auVar96._0_4_ * auVar89._0_4_;
        auVar40._8_4_ = auVar96._8_4_ * auVar89._8_4_;
        auVar40._12_4_ = auVar96._12_4_ * auVar89._12_4_;
        auVar40._16_4_ = auVar96._16_4_ * auVar89._16_4_;
        auVar40._20_4_ = auVar96._20_4_ * auVar89._20_4_;
        auVar40._24_4_ = auVar96._24_4_ * auVar89._24_4_;
        auVar40._28_4_ = auVar89._28_4_;
        auVar184 = vfmsub231ps_fma(auVar40,auVar95,auVar92);
        auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar184),auVar97,auVar93);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar97,ZEXT1632(auVar10));
        auVar88 = ZEXT1632(auVar85);
        uVar72 = vcmpps_avx512vl(auVar92,auVar88,2);
        bVar70 = (byte)uVar72;
        auVar106._0_4_ =
             (float)((uint)(bVar70 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar11._0_4_)
        ;
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar76 * auVar90._4_4_ | (uint)!bVar76 * auVar11._4_4_);
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar76 * auVar90._8_4_ | (uint)!bVar76 * auVar11._8_4_);
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar76 * auVar90._12_4_ | (uint)!bVar76 * auVar11._12_4_);
        fVar132 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar90._16_4_);
        auVar106._16_4_ = fVar132;
        fVar160 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar90._20_4_);
        auVar106._20_4_ = fVar160;
        fVar144 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar90._24_4_);
        auVar106._24_4_ = fVar144;
        auVar106._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar90._28_4_;
        auVar107._0_4_ =
             (float)((uint)(bVar70 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar12._0_4_)
        ;
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar76 * auVar91._4_4_ | (uint)!bVar76 * auVar12._4_4_);
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar76 * auVar91._8_4_ | (uint)!bVar76 * auVar12._8_4_);
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar76 * auVar91._12_4_ | (uint)!bVar76 * auVar12._12_4_);
        fVar145 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar91._16_4_);
        auVar107._16_4_ = fVar145;
        fVar146 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar91._20_4_);
        auVar107._20_4_ = fVar146;
        fVar164 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar91._24_4_);
        auVar107._24_4_ = fVar164;
        auVar107._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar91._28_4_;
        auVar108._0_4_ =
             (float)((uint)(bVar70 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar13._0_4_)
        ;
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar76 * auVar94._4_4_ | (uint)!bVar76 * auVar13._4_4_);
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar76 * auVar94._8_4_ | (uint)!bVar76 * auVar13._8_4_);
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar76 * auVar94._12_4_ | (uint)!bVar76 * auVar13._12_4_);
        fVar165 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar94._16_4_);
        auVar108._16_4_ = fVar165;
        fVar166 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar94._20_4_);
        auVar108._20_4_ = fVar166;
        fVar147 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar94._24_4_);
        auVar108._24_4_ = fVar147;
        iVar1 = (uint)(byte)(uVar72 >> 7) * auVar94._28_4_;
        auVar108._28_4_ = iVar1;
        auVar89 = vblendmps_avx512vl(auVar95,auVar100);
        auVar109._0_4_ =
             (uint)(bVar70 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar10._0_4_;
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar109._4_4_ = (uint)bVar76 * auVar89._4_4_ | (uint)!bVar76 * auVar10._4_4_;
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar109._8_4_ = (uint)bVar76 * auVar89._8_4_ | (uint)!bVar76 * auVar10._8_4_;
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar109._12_4_ = (uint)bVar76 * auVar89._12_4_ | (uint)!bVar76 * auVar10._12_4_;
        auVar109._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar89._16_4_;
        auVar109._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar89._20_4_;
        auVar109._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar89._24_4_;
        auVar109._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar89._28_4_;
        auVar89 = vblendmps_avx512vl(auVar96,ZEXT1632(auVar83));
        auVar110._0_4_ =
             (float)((uint)(bVar70 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar91._0_4_)
        ;
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar76 * auVar89._4_4_ | (uint)!bVar76 * auVar91._4_4_);
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar76 * auVar89._8_4_ | (uint)!bVar76 * auVar91._8_4_);
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar76 * auVar89._12_4_ | (uint)!bVar76 * auVar91._12_4_);
        bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar76 * auVar89._16_4_ | (uint)!bVar76 * auVar91._16_4_);
        bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar76 * auVar89._20_4_ | (uint)!bVar76 * auVar91._20_4_);
        bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar76 * auVar89._24_4_ | (uint)!bVar76 * auVar91._24_4_);
        bVar76 = SUB81(uVar72 >> 7,0);
        auVar110._28_4_ = (uint)bVar76 * auVar89._28_4_ | (uint)!bVar76 * auVar91._28_4_;
        auVar89 = vblendmps_avx512vl(auVar101,ZEXT1632(auVar79));
        auVar111._0_4_ =
             (float)((uint)(bVar70 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar94._0_4_)
        ;
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar76 * auVar89._4_4_ | (uint)!bVar76 * auVar94._4_4_);
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar76 * auVar89._8_4_ | (uint)!bVar76 * auVar94._8_4_);
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar76 * auVar89._12_4_ | (uint)!bVar76 * auVar94._12_4_);
        bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar76 * auVar89._16_4_ | (uint)!bVar76 * auVar94._16_4_);
        bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar76 * auVar89._20_4_ | (uint)!bVar76 * auVar94._20_4_);
        bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar76 * auVar89._24_4_ | (uint)!bVar76 * auVar94._24_4_);
        bVar76 = SUB81(uVar72 >> 7,0);
        auVar111._28_4_ = (uint)bVar76 * auVar89._28_4_ | (uint)!bVar76 * auVar94._28_4_;
        auVar112._0_4_ =
             (uint)(bVar70 & 1) * (int)auVar95._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar100._0_4_;
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar112._4_4_ = (uint)bVar76 * (int)auVar95._4_4_ | (uint)!bVar76 * auVar100._4_4_;
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar112._8_4_ = (uint)bVar76 * (int)auVar95._8_4_ | (uint)!bVar76 * auVar100._8_4_;
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar112._12_4_ = (uint)bVar76 * (int)auVar95._12_4_ | (uint)!bVar76 * auVar100._12_4_;
        bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar112._16_4_ = (uint)bVar76 * (int)auVar95._16_4_ | (uint)!bVar76 * auVar100._16_4_;
        bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar112._20_4_ = (uint)bVar76 * (int)auVar95._20_4_ | (uint)!bVar76 * auVar100._20_4_;
        bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar112._24_4_ = (uint)bVar76 * (int)auVar95._24_4_ | (uint)!bVar76 * auVar100._24_4_;
        bVar76 = SUB81(uVar72 >> 7,0);
        auVar112._28_4_ = (uint)bVar76 * auVar95._28_4_ | (uint)!bVar76 * auVar100._28_4_;
        auVar113._0_4_ =
             (uint)(bVar70 & 1) * (int)auVar96._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar83._0_4_;
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar113._4_4_ = (uint)bVar76 * (int)auVar96._4_4_ | (uint)!bVar76 * auVar83._4_4_;
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar113._8_4_ = (uint)bVar76 * (int)auVar96._8_4_ | (uint)!bVar76 * auVar83._8_4_;
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar113._12_4_ = (uint)bVar76 * (int)auVar96._12_4_ | (uint)!bVar76 * auVar83._12_4_;
        auVar113._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * (int)auVar96._16_4_;
        auVar113._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * (int)auVar96._20_4_;
        auVar113._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * (int)auVar96._24_4_;
        auVar113._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar96._28_4_;
        auVar114._0_4_ =
             (uint)(bVar70 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar79._0_4_;
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar76 * auVar101._4_4_ | (uint)!bVar76 * auVar79._4_4_;
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar76 * auVar101._8_4_ | (uint)!bVar76 * auVar79._8_4_;
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar76 * auVar101._12_4_ | (uint)!bVar76 * auVar79._12_4_;
        auVar114._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar101._16_4_;
        auVar114._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar101._20_4_;
        auVar114._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar101._24_4_;
        iVar2 = (uint)(byte)(uVar72 >> 7) * auVar101._28_4_;
        auVar114._28_4_ = iVar2;
        auVar101 = vsubps_avx512vl(auVar112,auVar106);
        auVar89 = vsubps_avx(auVar113,auVar107);
        auVar90 = vsubps_avx(auVar114,auVar108);
        auVar91 = vsubps_avx(auVar106,auVar109);
        auVar94 = vsubps_avx(auVar107,auVar110);
        auVar93 = vsubps_avx(auVar108,auVar111);
        auVar41._4_4_ = auVar90._4_4_ * auVar106._4_4_;
        auVar41._0_4_ = auVar90._0_4_ * auVar106._0_4_;
        auVar41._8_4_ = auVar90._8_4_ * auVar106._8_4_;
        auVar41._12_4_ = auVar90._12_4_ * auVar106._12_4_;
        auVar41._16_4_ = auVar90._16_4_ * fVar132;
        auVar41._20_4_ = auVar90._20_4_ * fVar160;
        auVar41._24_4_ = auVar90._24_4_ * fVar144;
        auVar41._28_4_ = iVar2;
        auVar83 = vfmsub231ps_fma(auVar41,auVar108,auVar101);
        auVar42._4_4_ = auVar107._4_4_ * auVar101._4_4_;
        auVar42._0_4_ = auVar107._0_4_ * auVar101._0_4_;
        auVar42._8_4_ = auVar107._8_4_ * auVar101._8_4_;
        auVar42._12_4_ = auVar107._12_4_ * auVar101._12_4_;
        auVar42._16_4_ = fVar145 * auVar101._16_4_;
        auVar42._20_4_ = fVar146 * auVar101._20_4_;
        auVar42._24_4_ = fVar164 * auVar101._24_4_;
        auVar42._28_4_ = auVar92._28_4_;
        auVar79 = vfmsub231ps_fma(auVar42,auVar106,auVar89);
        auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar88,ZEXT1632(auVar83));
        auVar154._0_4_ = auVar89._0_4_ * auVar108._0_4_;
        auVar154._4_4_ = auVar89._4_4_ * auVar108._4_4_;
        auVar154._8_4_ = auVar89._8_4_ * auVar108._8_4_;
        auVar154._12_4_ = auVar89._12_4_ * auVar108._12_4_;
        auVar154._16_4_ = auVar89._16_4_ * fVar165;
        auVar154._20_4_ = auVar89._20_4_ * fVar166;
        auVar154._24_4_ = auVar89._24_4_ * fVar147;
        auVar154._28_4_ = 0;
        auVar83 = vfmsub231ps_fma(auVar154,auVar107,auVar90);
        auVar100 = vfmadd231ps_avx512vl(auVar92,auVar88,ZEXT1632(auVar83));
        auVar92 = vmulps_avx512vl(auVar93,auVar109);
        auVar92 = vfmsub231ps_avx512vl(auVar92,auVar91,auVar111);
        auVar43._4_4_ = auVar94._4_4_ * auVar111._4_4_;
        auVar43._0_4_ = auVar94._0_4_ * auVar111._0_4_;
        auVar43._8_4_ = auVar94._8_4_ * auVar111._8_4_;
        auVar43._12_4_ = auVar94._12_4_ * auVar111._12_4_;
        auVar43._16_4_ = auVar94._16_4_ * auVar111._16_4_;
        auVar43._20_4_ = auVar94._20_4_ * auVar111._20_4_;
        auVar43._24_4_ = auVar94._24_4_ * auVar111._24_4_;
        auVar43._28_4_ = auVar111._28_4_;
        auVar83 = vfmsub231ps_fma(auVar43,auVar110,auVar93);
        auVar155._0_4_ = auVar110._0_4_ * auVar91._0_4_;
        auVar155._4_4_ = auVar110._4_4_ * auVar91._4_4_;
        auVar155._8_4_ = auVar110._8_4_ * auVar91._8_4_;
        auVar155._12_4_ = auVar110._12_4_ * auVar91._12_4_;
        auVar155._16_4_ = auVar110._16_4_ * auVar91._16_4_;
        auVar155._20_4_ = auVar110._20_4_ * auVar91._20_4_;
        auVar155._24_4_ = auVar110._24_4_ * auVar91._24_4_;
        auVar155._28_4_ = 0;
        auVar79 = vfmsub231ps_fma(auVar155,auVar94,auVar109);
        auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar88,auVar92);
        auVar95 = vfmadd231ps_avx512vl(auVar92,auVar88,ZEXT1632(auVar83));
        auVar92 = vmaxps_avx(auVar100,auVar95);
        uVar140 = vcmpps_avx512vl(auVar92,auVar88,2);
        bVar78 = bVar78 & (byte)uVar140;
        auVar179 = ZEXT3264(local_360);
        auVar183 = ZEXT3264(local_380);
        auVar189 = ZEXT3264(local_3e0);
        auVar191 = ZEXT3264(local_3a0);
        auVar187 = ZEXT3264(local_400);
        auVar190 = ZEXT3264(local_420);
        auVar188 = ZEXT3264(local_3c0);
        if (bVar78 == 0) {
          auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar186 = ZEXT3264(auVar92);
        }
        else {
          auVar44._4_4_ = auVar93._4_4_ * auVar89._4_4_;
          auVar44._0_4_ = auVar93._0_4_ * auVar89._0_4_;
          auVar44._8_4_ = auVar93._8_4_ * auVar89._8_4_;
          auVar44._12_4_ = auVar93._12_4_ * auVar89._12_4_;
          auVar44._16_4_ = auVar93._16_4_ * auVar89._16_4_;
          auVar44._20_4_ = auVar93._20_4_ * auVar89._20_4_;
          auVar44._24_4_ = auVar93._24_4_ * auVar89._24_4_;
          auVar44._28_4_ = auVar92._28_4_;
          auVar10 = vfmsub231ps_fma(auVar44,auVar94,auVar90);
          auVar45._4_4_ = auVar90._4_4_ * auVar91._4_4_;
          auVar45._0_4_ = auVar90._0_4_ * auVar91._0_4_;
          auVar45._8_4_ = auVar90._8_4_ * auVar91._8_4_;
          auVar45._12_4_ = auVar90._12_4_ * auVar91._12_4_;
          auVar45._16_4_ = auVar90._16_4_ * auVar91._16_4_;
          auVar45._20_4_ = auVar90._20_4_ * auVar91._20_4_;
          auVar45._24_4_ = auVar90._24_4_ * auVar91._24_4_;
          auVar45._28_4_ = auVar90._28_4_;
          auVar79 = vfmsub231ps_fma(auVar45,auVar101,auVar93);
          auVar46._4_4_ = auVar94._4_4_ * auVar101._4_4_;
          auVar46._0_4_ = auVar94._0_4_ * auVar101._0_4_;
          auVar46._8_4_ = auVar94._8_4_ * auVar101._8_4_;
          auVar46._12_4_ = auVar94._12_4_ * auVar101._12_4_;
          auVar46._16_4_ = auVar94._16_4_ * auVar101._16_4_;
          auVar46._20_4_ = auVar94._20_4_ * auVar101._20_4_;
          auVar46._24_4_ = auVar94._24_4_ * auVar101._24_4_;
          auVar46._28_4_ = auVar94._28_4_;
          auVar184 = vfmsub231ps_fma(auVar46,auVar91,auVar89);
          auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar79),ZEXT1632(auVar184));
          auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar10),auVar88);
          auVar92 = vrcp14ps_avx512vl(auVar89);
          auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar186 = ZEXT3264(auVar90);
          auVar91 = vfnmadd213ps_avx512vl(auVar92,auVar89,auVar90);
          auVar83 = vfmadd132ps_fma(auVar91,auVar92,auVar92);
          auVar47._4_4_ = auVar184._4_4_ * auVar108._4_4_;
          auVar47._0_4_ = auVar184._0_4_ * auVar108._0_4_;
          auVar47._8_4_ = auVar184._8_4_ * auVar108._8_4_;
          auVar47._12_4_ = auVar184._12_4_ * auVar108._12_4_;
          auVar47._16_4_ = fVar165 * 0.0;
          auVar47._20_4_ = fVar166 * 0.0;
          auVar47._24_4_ = fVar147 * 0.0;
          auVar47._28_4_ = iVar1;
          auVar79 = vfmadd231ps_fma(auVar47,auVar107,ZEXT1632(auVar79));
          auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar106,ZEXT1632(auVar10));
          fVar132 = auVar83._0_4_;
          fVar144 = auVar83._4_4_;
          fVar145 = auVar83._8_4_;
          fVar146 = auVar83._12_4_;
          local_220 = ZEXT1632(CONCAT412(auVar79._12_4_ * fVar146,
                                         CONCAT48(auVar79._8_4_ * fVar145,
                                                  CONCAT44(auVar79._4_4_ * fVar144,
                                                           auVar79._0_4_ * fVar132))));
          auVar170._8_4_ = 3;
          auVar170._0_8_ = 0x300000003;
          auVar170._12_4_ = 3;
          auVar170._16_4_ = 3;
          auVar170._20_4_ = 3;
          auVar170._24_4_ = 3;
          auVar170._28_4_ = 3;
          auVar92 = vpermps_avx2(auVar170,ZEXT1632((undefined1  [16])aVar5));
          uVar140 = vcmpps_avx512vl(auVar92,local_220,2);
          fVar160 = local_540->tfar;
          auVar26._4_4_ = fVar160;
          auVar26._0_4_ = fVar160;
          auVar26._8_4_ = fVar160;
          auVar26._12_4_ = fVar160;
          auVar26._16_4_ = fVar160;
          auVar26._20_4_ = fVar160;
          auVar26._24_4_ = fVar160;
          auVar26._28_4_ = fVar160;
          uVar24 = vcmpps_avx512vl(local_220,auVar26,2);
          bVar78 = (byte)uVar140 & (byte)uVar24 & bVar78;
          if (bVar78 != 0) {
            uVar140 = vcmpps_avx512vl(auVar89,auVar88,4);
            bVar78 = bVar78 & (byte)uVar140;
            if (bVar78 != 0) {
              fVar160 = auVar100._0_4_ * fVar132;
              fVar164 = auVar100._4_4_ * fVar144;
              auVar48._4_4_ = fVar164;
              auVar48._0_4_ = fVar160;
              fVar165 = auVar100._8_4_ * fVar145;
              auVar48._8_4_ = fVar165;
              fVar166 = auVar100._12_4_ * fVar146;
              auVar48._12_4_ = fVar166;
              fVar147 = auVar100._16_4_ * 0.0;
              auVar48._16_4_ = fVar147;
              fVar167 = auVar100._20_4_ * 0.0;
              auVar48._20_4_ = fVar167;
              fVar168 = auVar100._24_4_ * 0.0;
              auVar48._24_4_ = fVar168;
              auVar48._28_4_ = auVar89._28_4_;
              auVar92 = vsubps_avx512vl(auVar90,auVar48);
              local_260._0_4_ =
                   (float)((uint)(bVar70 & 1) * (int)fVar160 |
                          (uint)!(bool)(bVar70 & 1) * auVar92._0_4_);
              bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
              local_260._4_4_ = (float)((uint)bVar76 * (int)fVar164 | (uint)!bVar76 * auVar92._4_4_)
              ;
              bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
              local_260._8_4_ = (float)((uint)bVar76 * (int)fVar165 | (uint)!bVar76 * auVar92._8_4_)
              ;
              bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
              local_260._12_4_ =
                   (float)((uint)bVar76 * (int)fVar166 | (uint)!bVar76 * auVar92._12_4_);
              bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
              local_260._16_4_ =
                   (float)((uint)bVar76 * (int)fVar147 | (uint)!bVar76 * auVar92._16_4_);
              bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
              local_260._20_4_ =
                   (float)((uint)bVar76 * (int)fVar167 | (uint)!bVar76 * auVar92._20_4_);
              bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
              local_260._24_4_ =
                   (float)((uint)bVar76 * (int)fVar168 | (uint)!bVar76 * auVar92._24_4_);
              bVar76 = SUB81(uVar72 >> 7,0);
              local_260._28_4_ =
                   (float)((uint)bVar76 * auVar89._28_4_ | (uint)!bVar76 * auVar92._28_4_);
              auVar92 = vsubps_avx512vl(ZEXT1632(auVar80),auVar86);
              auVar92 = vfmadd213ps_avx512vl(auVar92,local_260,auVar86);
              auVar138._0_4_ = auVar92._0_4_ + auVar92._0_4_;
              auVar138._4_4_ = auVar92._4_4_ + auVar92._4_4_;
              auVar138._8_4_ = auVar92._8_4_ + auVar92._8_4_;
              auVar138._12_4_ = auVar92._12_4_ + auVar92._12_4_;
              auVar138._16_4_ = auVar92._16_4_ + auVar92._16_4_;
              auVar138._20_4_ = auVar92._20_4_ + auVar92._20_4_;
              auVar138._24_4_ = auVar92._24_4_ + auVar92._24_4_;
              fVar164 = auVar92._28_4_;
              auVar138._28_4_ = fVar164 + fVar164;
              fVar160 = local_528->depth_scale;
              auVar27._4_4_ = fVar160;
              auVar27._0_4_ = fVar160;
              auVar27._8_4_ = fVar160;
              auVar27._12_4_ = fVar160;
              auVar27._16_4_ = fVar160;
              auVar27._20_4_ = fVar160;
              auVar27._24_4_ = fVar160;
              auVar27._28_4_ = fVar160;
              auVar92 = vmulps_avx512vl(auVar138,auVar27);
              uVar140 = vcmpps_avx512vl(local_220,auVar92,6);
              if (((byte)uVar140 & bVar78) != 0) {
                auVar8._0_4_ = local_540->tfar;
                auVar8._4_4_ = local_540->mask;
                auVar8._8_4_ = local_540->id;
                auVar8._12_4_ = local_540->flags;
                uVar71 = vextractps_avx(auVar8,1);
                fVar132 = auVar95._0_4_ * fVar132;
                fVar144 = auVar95._4_4_ * fVar144;
                auVar49._4_4_ = fVar144;
                auVar49._0_4_ = fVar132;
                fVar145 = auVar95._8_4_ * fVar145;
                auVar49._8_4_ = fVar145;
                fVar146 = auVar95._12_4_ * fVar146;
                auVar49._12_4_ = fVar146;
                fVar160 = auVar95._16_4_ * 0.0;
                auVar49._16_4_ = fVar160;
                fVar165 = auVar95._20_4_ * 0.0;
                auVar49._20_4_ = fVar165;
                fVar166 = auVar95._24_4_ * 0.0;
                auVar49._24_4_ = fVar166;
                auVar49._28_4_ = fVar164;
                auVar92 = vsubps_avx512vl(auVar90,auVar49);
                auVar115._0_4_ =
                     (uint)(bVar70 & 1) * (int)fVar132 | (uint)!(bool)(bVar70 & 1) * auVar92._0_4_;
                bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
                auVar115._4_4_ = (uint)bVar76 * (int)fVar144 | (uint)!bVar76 * auVar92._4_4_;
                bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
                auVar115._8_4_ = (uint)bVar76 * (int)fVar145 | (uint)!bVar76 * auVar92._8_4_;
                bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
                auVar115._12_4_ = (uint)bVar76 * (int)fVar146 | (uint)!bVar76 * auVar92._12_4_;
                bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
                auVar115._16_4_ = (uint)bVar76 * (int)fVar160 | (uint)!bVar76 * auVar92._16_4_;
                bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
                auVar115._20_4_ = (uint)bVar76 * (int)fVar165 | (uint)!bVar76 * auVar92._20_4_;
                bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
                auVar115._24_4_ = (uint)bVar76 * (int)fVar166 | (uint)!bVar76 * auVar92._24_4_;
                bVar76 = SUB81(uVar72 >> 7,0);
                auVar115._28_4_ = (uint)bVar76 * (int)fVar164 | (uint)!bVar76 * auVar92._28_4_;
                auVar28._8_4_ = 0x40000000;
                auVar28._0_8_ = 0x4000000040000000;
                auVar28._12_4_ = 0x40000000;
                auVar28._16_4_ = 0x40000000;
                auVar28._20_4_ = 0x40000000;
                auVar28._24_4_ = 0x40000000;
                auVar28._28_4_ = 0x40000000;
                local_240 = vfmsub132ps_avx512vl(auVar115,auVar90,auVar28);
                local_200 = 0;
                local_1fc = iVar15;
                local_1f0 = local_470;
                local_1e0 = local_480;
                local_1d0 = *(undefined8 *)*pauVar3;
                uStack_1c8 = *(undefined8 *)(*pauVar3 + 8);
                if ((pGVar16->mask & uVar71) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar76 = true, pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar160 = 1.0 / auVar176._0_4_;
                    local_1a0[0] = fVar160 * (local_260._0_4_ + 0.0);
                    local_1a0[1] = fVar160 * (local_260._4_4_ + 1.0);
                    local_1a0[2] = fVar160 * (local_260._8_4_ + 2.0);
                    local_1a0[3] = fVar160 * (local_260._12_4_ + 3.0);
                    fStack_190 = fVar160 * (local_260._16_4_ + 4.0);
                    fStack_18c = fVar160 * (local_260._20_4_ + 5.0);
                    fStack_188 = fVar160 * (local_260._24_4_ + 6.0);
                    fStack_184 = local_260._28_4_ + 7.0;
                    local_180 = local_240;
                    local_160 = local_220;
                    lVar74 = 0;
                    uVar75 = (ulong)((byte)uVar140 & bVar78);
                    for (uVar72 = uVar75; (uVar72 & 1) == 0;
                        uVar72 = uVar72 >> 1 | 0x8000000000000000) {
                      lVar74 = lVar74 + 1;
                    }
                    local_4e0 = auVar82;
                    local_460 = auVar8;
                    do {
                      auVar184 = auVar185._0_16_;
                      local_2c0._0_8_ = uVar75;
                      local_4c4 = local_1a0[lVar74];
                      local_4c0 = *(undefined4 *)(local_180 + lVar74 * 4);
                      local_2a0._0_8_ = lVar74;
                      local_540->tfar = *(float *)(local_160 + lVar74 * 4);
                      local_510.context = context->user;
                      fVar160 = 1.0 - local_4c4;
                      auVar10 = vfnmadd231ss_fma(ZEXT416((uint)(local_4c4 * (fVar160 + fVar160))),
                                                 ZEXT416((uint)fVar160),ZEXT416((uint)fVar160));
                      auVar79 = ZEXT416((uint)local_4c4);
                      auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar79,
                                                ZEXT416(0xc0a00000));
                      auVar83 = vfmadd231ss_fma(ZEXT416((uint)(local_4c4 * local_4c4 * 3.0)),
                                                ZEXT416((uint)(local_4c4 + local_4c4)),auVar82);
                      auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar79,
                                                ZEXT416(0x40000000));
                      auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160 * -3.0)),
                                                ZEXT416((uint)(fVar160 + fVar160)),auVar82);
                      auVar79 = vfmadd231ss_fma(ZEXT416((uint)(local_4c4 * local_4c4)),auVar79,
                                                ZEXT416((uint)(fVar160 * -2.0)));
                      fVar160 = auVar10._0_4_ * 0.5;
                      fVar132 = auVar83._0_4_ * 0.5;
                      fVar144 = auVar82._0_4_ * 0.5;
                      fVar145 = auVar79._0_4_ * 0.5;
                      auVar148._0_4_ = fVar145 * local_450;
                      auVar148._4_4_ = fVar145 * fStack_44c;
                      auVar148._8_4_ = fVar145 * fStack_448;
                      auVar148._12_4_ = fVar145 * fStack_444;
                      auVar158._4_4_ = fVar144;
                      auVar158._0_4_ = fVar144;
                      auVar158._8_4_ = fVar144;
                      auVar158._12_4_ = fVar144;
                      auVar68._8_8_ = uStack_518;
                      auVar68._0_8_ = local_520;
                      auVar82 = vfmadd132ps_fma(auVar158,auVar148,auVar68);
                      auVar149._4_4_ = fVar132;
                      auVar149._0_4_ = fVar132;
                      auVar149._8_4_ = fVar132;
                      auVar149._12_4_ = fVar132;
                      auVar82 = vfmadd213ps_fma(auVar149,local_480,auVar82);
                      auVar141._4_4_ = fVar160;
                      auVar141._0_4_ = fVar160;
                      auVar141._8_4_ = fVar160;
                      auVar141._12_4_ = fVar160;
                      auVar82 = vfmadd213ps_fma(auVar141,local_470,auVar82);
                      local_4d0 = vmovlps_avx(auVar82);
                      local_4c8 = vextractps_avx(auVar82,2);
                      local_4bc = (int)local_488;
                      local_4b8 = (int)local_530;
                      local_4b4 = (local_510.context)->instID[0];
                      local_4b0 = (local_510.context)->instPrimID[0];
                      local_544 = -1;
                      local_510.valid = &local_544;
                      local_510.geometryUserPtr = pGVar16->userPtr;
                      local_510.ray = (RTCRayN *)local_540;
                      local_510.hit = (RTCHitN *)&local_4d0;
                      local_510.N = 1;
                      if ((pGVar16->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar16->occlusionFilterN)(&local_510), *local_510.valid != 0)) {
                        p_Var17 = context->args->filter;
                        if ((p_Var17 == (RTCFilterFunctionN)0x0) ||
                           ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                              RTC_RAY_QUERY_FLAG_INCOHERENT &&
                             (((pGVar16->field_8).field_0x2 & 0x40) == 0)) ||
                            ((*p_Var17)(&local_510), *local_510.valid != 0)))) {
                          bVar76 = true;
                          auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar186 = ZEXT3264(auVar92);
                          auVar82 = vxorps_avx512vl(auVar184,auVar184);
                          auVar185 = ZEXT1664(auVar82);
                          auVar179 = ZEXT3264(local_360);
                          auVar183 = ZEXT3264(local_380);
                          auVar189 = ZEXT3264(local_3e0);
                          auVar191 = ZEXT3264(local_3a0);
                          auVar187 = ZEXT3264(local_400);
                          auVar190 = ZEXT3264(local_420);
                          auVar188 = ZEXT3264(local_3c0);
                          auVar192 = ZEXT3264(local_440);
                          auVar82 = local_4e0;
                          break;
                        }
                      }
                      local_540->tfar = (float)local_460._0_4_;
                      bVar76 = false;
                      lVar74 = 0;
                      uVar75 = local_2c0._0_8_ ^ 1L << (local_2a0._0_8_ & 0x3f);
                      for (uVar72 = uVar75; (uVar72 & 1) == 0;
                          uVar72 = uVar72 >> 1 | 0x8000000000000000) {
                        lVar74 = lVar74 + 1;
                      }
                      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar186 = ZEXT3264(auVar92);
                      auVar82 = vxorps_avx512vl(auVar184,auVar184);
                      auVar185 = ZEXT1664(auVar82);
                      auVar179 = ZEXT3264(local_360);
                      auVar183 = ZEXT3264(local_380);
                      auVar189 = ZEXT3264(local_3e0);
                      auVar191 = ZEXT3264(local_3a0);
                      auVar187 = ZEXT3264(local_400);
                      auVar190 = ZEXT3264(local_420);
                      auVar188 = ZEXT3264(local_3c0);
                      auVar192 = ZEXT3264(local_440);
                      auVar82 = local_4e0;
                    } while (uVar75 != 0);
                  }
                  goto LAB_01d228a3;
                }
              }
            }
            bVar76 = false;
            goto LAB_01d228a3;
          }
        }
        bVar76 = false;
      }
LAB_01d228a3:
      if (8 < iVar15) {
        local_2a0 = vpbroadcastd_avx512vl();
        local_2c0 = vbroadcastss_avx512vl(auVar82);
        auVar136._8_4_ = 3;
        auVar136._0_8_ = 0x300000003;
        auVar136._12_4_ = 3;
        auVar136._16_4_ = 3;
        auVar136._20_4_ = 3;
        auVar136._24_4_ = 3;
        auVar136._28_4_ = 3;
        local_2e0 = vpermps_avx2(auVar136,local_2e0);
        local_300._4_4_ = 1.0 / (float)local_300._0_4_;
        local_300._0_4_ = local_300._4_4_;
        fStack_2f8 = (float)local_300._4_4_;
        fStack_2f4 = (float)local_300._4_4_;
        fStack_2f0 = (float)local_300._4_4_;
        fStack_2ec = (float)local_300._4_4_;
        fStack_2e8 = (float)local_300._4_4_;
        fStack_2e4 = (float)local_300._4_4_;
        lVar74 = 8;
        do {
          auVar92 = vpbroadcastd_avx512vl();
          auVar94 = vpor_avx2(auVar92,_DAT_01fe9900);
          uVar24 = vpcmpd_avx512vl(auVar94,local_2a0,1);
          auVar92 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar74 * 4 + lVar25);
          auVar89 = *(undefined1 (*) [32])(lVar25 + 0x21b37f0 + lVar74 * 4);
          auVar90 = *(undefined1 (*) [32])(lVar25 + 0x21b3c74 + lVar74 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar25 + 0x21b40f8 + lVar74 * 4);
          local_3c0 = auVar188._0_32_;
          auVar93 = vmulps_avx512vl(local_3c0,auVar91);
          auVar143 = auVar192._0_32_;
          auVar101 = vmulps_avx512vl(auVar143,auVar91);
          auVar50._4_4_ = auVar91._4_4_ * (float)local_100._4_4_;
          auVar50._0_4_ = auVar91._0_4_ * (float)local_100._0_4_;
          auVar50._8_4_ = auVar91._8_4_ * fStack_f8;
          auVar50._12_4_ = auVar91._12_4_ * fStack_f4;
          auVar50._16_4_ = auVar91._16_4_ * fStack_f0;
          auVar50._20_4_ = auVar91._20_4_ * fStack_ec;
          auVar50._24_4_ = auVar91._24_4_ * fStack_e8;
          auVar50._28_4_ = auVar94._28_4_;
          auVar99 = auVar187._0_32_;
          auVar94 = vfmadd231ps_avx512vl(auVar93,auVar90,auVar99);
          auVar137 = auVar190._0_32_;
          auVar93 = vfmadd231ps_avx512vl(auVar101,auVar90,auVar137);
          auVar101 = vfmadd231ps_avx512vl(auVar50,auVar90,local_e0);
          auVar134 = auVar189._0_32_;
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,auVar134);
          local_3a0 = auVar191._0_32_;
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,local_3a0);
          auVar82 = vfmadd231ps_fma(auVar101,auVar89,local_c0);
          local_360 = auVar179._0_32_;
          auVar83 = vfmadd231ps_fma(auVar94,auVar92,local_360);
          local_380 = auVar183._0_32_;
          auVar79 = vfmadd231ps_fma(auVar93,auVar92,local_380);
          auVar94 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar74 * 4 + lVar25);
          auVar93 = *(undefined1 (*) [32])(lVar25 + 0x21b5c10 + lVar74 * 4);
          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar92,local_a0);
          auVar101 = *(undefined1 (*) [32])(lVar25 + 0x21b6094 + lVar74 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar25 + 0x21b6518 + lVar74 * 4);
          auVar95 = vmulps_avx512vl(local_3c0,auVar100);
          auVar96 = vmulps_avx512vl(auVar143,auVar100);
          auVar51._4_4_ = auVar100._4_4_ * (float)local_100._4_4_;
          auVar51._0_4_ = auVar100._0_4_ * (float)local_100._0_4_;
          auVar51._8_4_ = auVar100._8_4_ * fStack_f8;
          auVar51._12_4_ = auVar100._12_4_ * fStack_f4;
          auVar51._16_4_ = auVar100._16_4_ * fStack_f0;
          auVar51._20_4_ = auVar100._20_4_ * fStack_ec;
          auVar51._24_4_ = auVar100._24_4_ * fStack_e8;
          auVar51._28_4_ = uStack_e4;
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar101,auVar99);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar101,auVar137);
          auVar88 = vfmadd231ps_avx512vl(auVar51,auVar101,local_e0);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,auVar134);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,local_3a0);
          auVar10 = vfmadd231ps_fma(auVar88,auVar93,local_c0);
          auVar88 = vfmadd231ps_avx512vl(auVar95,auVar94,local_360);
          auVar97 = vfmadd231ps_avx512vl(auVar96,auVar94,local_380);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar94,local_a0);
          auVar98 = vmaxps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar10));
          auVar95 = vsubps_avx(auVar88,ZEXT1632(auVar83));
          auVar96 = vsubps_avx(auVar97,ZEXT1632(auVar79));
          auVar86 = vmulps_avx512vl(ZEXT1632(auVar79),auVar95);
          auVar87 = vmulps_avx512vl(ZEXT1632(auVar83),auVar96);
          auVar86 = vsubps_avx512vl(auVar86,auVar87);
          auVar87 = vmulps_avx512vl(auVar96,auVar96);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar95,auVar95);
          auVar98 = vmulps_avx512vl(auVar98,auVar98);
          auVar98 = vmulps_avx512vl(auVar98,auVar87);
          auVar86 = vmulps_avx512vl(auVar86,auVar86);
          uVar140 = vcmpps_avx512vl(auVar86,auVar98,2);
          bVar78 = (byte)uVar24 & (byte)uVar140;
          if (bVar78 == 0) {
            auVar179 = ZEXT3264(local_360);
            auVar183 = ZEXT3264(local_380);
          }
          else {
            auVar100 = vmulps_avx512vl(local_140,auVar100);
            auVar101 = vfmadd213ps_avx512vl(auVar101,local_120,auVar100);
            auVar93 = vfmadd213ps_avx512vl(auVar93,local_340,auVar101);
            auVar94 = vfmadd213ps_avx512vl(auVar94,local_320,auVar93);
            auVar91 = vmulps_avx512vl(local_140,auVar91);
            auVar90 = vfmadd213ps_avx512vl(auVar90,local_120,auVar91);
            auVar89 = vfmadd213ps_avx512vl(auVar89,local_340,auVar90);
            auVar93 = vfmadd213ps_avx512vl(auVar92,local_320,auVar89);
            auVar92 = *(undefined1 (*) [32])(lVar25 + 0x21b457c + lVar74 * 4);
            auVar89 = *(undefined1 (*) [32])(lVar25 + 0x21b4a00 + lVar74 * 4);
            auVar90 = *(undefined1 (*) [32])(lVar25 + 0x21b4e84 + lVar74 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar25 + 0x21b5308 + lVar74 * 4);
            auVar101 = vmulps_avx512vl(local_3c0,auVar91);
            auVar100 = vmulps_avx512vl(auVar143,auVar91);
            auVar91 = vmulps_avx512vl(local_140,auVar91);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar90,auVar99);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar90,auVar137);
            auVar90 = vfmadd231ps_avx512vl(auVar91,local_120,auVar90);
            auVar91 = vfmadd231ps_avx512vl(auVar101,auVar89,auVar134);
            auVar101 = vfmadd231ps_avx512vl(auVar100,auVar89,local_3a0);
            auVar89 = vfmadd231ps_avx512vl(auVar90,local_340,auVar89);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar92,local_360);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar92,local_380);
            auVar100 = vfmadd231ps_avx512vl(auVar89,local_320,auVar92);
            auVar92 = *(undefined1 (*) [32])(lVar25 + 0x21b699c + lVar74 * 4);
            auVar89 = *(undefined1 (*) [32])(lVar25 + 0x21b72a4 + lVar74 * 4);
            auVar90 = *(undefined1 (*) [32])(lVar25 + 0x21b7728 + lVar74 * 4);
            auVar98 = vmulps_avx512vl(local_3c0,auVar90);
            auVar86 = vmulps_avx512vl(auVar143,auVar90);
            auVar90 = vmulps_avx512vl(local_140,auVar90);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar89,auVar99);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar89,auVar137);
            auVar90 = vfmadd231ps_avx512vl(auVar90,local_120,auVar89);
            auVar89 = *(undefined1 (*) [32])(lVar25 + 0x21b6e20 + lVar74 * 4);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar89,auVar134);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar89,local_3a0);
            auVar89 = vfmadd231ps_avx512vl(auVar90,local_340,auVar89);
            auVar90 = vfmadd231ps_avx512vl(auVar98,auVar92,local_360);
            auVar98 = vfmadd231ps_avx512vl(auVar86,auVar92,local_380);
            auVar89 = vfmadd231ps_avx512vl(auVar89,local_320,auVar92);
            auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar91,auVar86);
            vandps_avx512vl(auVar101,auVar86);
            auVar92 = vmaxps_avx(auVar86,auVar86);
            vandps_avx512vl(auVar100,auVar86);
            auVar92 = vmaxps_avx(auVar92,auVar86);
            uVar72 = vcmpps_avx512vl(auVar92,local_2c0,1);
            bVar18 = (bool)((byte)uVar72 & 1);
            auVar116._0_4_ = (float)((uint)bVar18 * auVar95._0_4_ | (uint)!bVar18 * auVar91._0_4_);
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar116._4_4_ = (float)((uint)bVar18 * auVar95._4_4_ | (uint)!bVar18 * auVar91._4_4_);
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar116._8_4_ = (float)((uint)bVar18 * auVar95._8_4_ | (uint)!bVar18 * auVar91._8_4_);
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar116._12_4_ =
                 (float)((uint)bVar18 * auVar95._12_4_ | (uint)!bVar18 * auVar91._12_4_);
            bVar18 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar116._16_4_ =
                 (float)((uint)bVar18 * auVar95._16_4_ | (uint)!bVar18 * auVar91._16_4_);
            bVar18 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar116._20_4_ =
                 (float)((uint)bVar18 * auVar95._20_4_ | (uint)!bVar18 * auVar91._20_4_);
            bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar116._24_4_ =
                 (float)((uint)bVar18 * auVar95._24_4_ | (uint)!bVar18 * auVar91._24_4_);
            bVar18 = SUB81(uVar72 >> 7,0);
            auVar116._28_4_ = (uint)bVar18 * auVar95._28_4_ | (uint)!bVar18 * auVar91._28_4_;
            bVar18 = (bool)((byte)uVar72 & 1);
            auVar117._0_4_ = (float)((uint)bVar18 * auVar96._0_4_ | (uint)!bVar18 * auVar101._0_4_);
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar18 * auVar96._4_4_ | (uint)!bVar18 * auVar101._4_4_);
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar18 * auVar96._8_4_ | (uint)!bVar18 * auVar101._8_4_);
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar18 * auVar96._12_4_ | (uint)!bVar18 * auVar101._12_4_);
            bVar18 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar117._16_4_ =
                 (float)((uint)bVar18 * auVar96._16_4_ | (uint)!bVar18 * auVar101._16_4_);
            bVar18 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar117._20_4_ =
                 (float)((uint)bVar18 * auVar96._20_4_ | (uint)!bVar18 * auVar101._20_4_);
            bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar117._24_4_ =
                 (float)((uint)bVar18 * auVar96._24_4_ | (uint)!bVar18 * auVar101._24_4_);
            bVar18 = SUB81(uVar72 >> 7,0);
            auVar117._28_4_ = (uint)bVar18 * auVar96._28_4_ | (uint)!bVar18 * auVar101._28_4_;
            vandps_avx512vl(auVar90,auVar86);
            vandps_avx512vl(auVar98,auVar86);
            auVar92 = vmaxps_avx(auVar117,auVar117);
            vandps_avx512vl(auVar89,auVar86);
            auVar92 = vmaxps_avx(auVar92,auVar117);
            uVar72 = vcmpps_avx512vl(auVar92,local_2c0,1);
            bVar18 = (bool)((byte)uVar72 & 1);
            auVar118._0_4_ = (uint)bVar18 * auVar95._0_4_ | (uint)!bVar18 * auVar90._0_4_;
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar118._4_4_ = (uint)bVar18 * auVar95._4_4_ | (uint)!bVar18 * auVar90._4_4_;
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar118._8_4_ = (uint)bVar18 * auVar95._8_4_ | (uint)!bVar18 * auVar90._8_4_;
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar118._12_4_ = (uint)bVar18 * auVar95._12_4_ | (uint)!bVar18 * auVar90._12_4_;
            bVar18 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar118._16_4_ = (uint)bVar18 * auVar95._16_4_ | (uint)!bVar18 * auVar90._16_4_;
            bVar18 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar118._20_4_ = (uint)bVar18 * auVar95._20_4_ | (uint)!bVar18 * auVar90._20_4_;
            bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar118._24_4_ = (uint)bVar18 * auVar95._24_4_ | (uint)!bVar18 * auVar90._24_4_;
            bVar18 = SUB81(uVar72 >> 7,0);
            auVar118._28_4_ = (uint)bVar18 * auVar95._28_4_ | (uint)!bVar18 * auVar90._28_4_;
            bVar18 = (bool)((byte)uVar72 & 1);
            auVar119._0_4_ = (float)((uint)bVar18 * auVar96._0_4_ | (uint)!bVar18 * auVar98._0_4_);
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar119._4_4_ = (float)((uint)bVar18 * auVar96._4_4_ | (uint)!bVar18 * auVar98._4_4_);
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar119._8_4_ = (float)((uint)bVar18 * auVar96._8_4_ | (uint)!bVar18 * auVar98._8_4_);
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar119._12_4_ =
                 (float)((uint)bVar18 * auVar96._12_4_ | (uint)!bVar18 * auVar98._12_4_);
            bVar18 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar119._16_4_ =
                 (float)((uint)bVar18 * auVar96._16_4_ | (uint)!bVar18 * auVar98._16_4_);
            bVar18 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar119._20_4_ =
                 (float)((uint)bVar18 * auVar96._20_4_ | (uint)!bVar18 * auVar98._20_4_);
            bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar119._24_4_ =
                 (float)((uint)bVar18 * auVar96._24_4_ | (uint)!bVar18 * auVar98._24_4_);
            bVar18 = SUB81(uVar72 >> 7,0);
            auVar119._28_4_ = (uint)bVar18 * auVar96._28_4_ | (uint)!bVar18 * auVar98._28_4_;
            auVar173._8_4_ = 0x80000000;
            auVar173._0_8_ = 0x8000000080000000;
            auVar173._12_4_ = 0x80000000;
            auVar173._16_4_ = 0x80000000;
            auVar173._20_4_ = 0x80000000;
            auVar173._24_4_ = 0x80000000;
            auVar173._28_4_ = 0x80000000;
            auVar92 = vxorps_avx512vl(auVar118,auVar173);
            auVar87 = auVar185._0_32_;
            auVar89 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar87);
            auVar184 = vfmadd231ps_fma(auVar89,auVar117,auVar117);
            auVar89 = vrsqrt14ps_avx512vl(ZEXT1632(auVar184));
            auVar182._8_4_ = 0xbf000000;
            auVar182._0_8_ = 0xbf000000bf000000;
            auVar182._12_4_ = 0xbf000000;
            auVar182._16_4_ = 0xbf000000;
            auVar182._20_4_ = 0xbf000000;
            auVar182._24_4_ = 0xbf000000;
            auVar182._28_4_ = 0xbf000000;
            fVar160 = auVar89._0_4_;
            fVar132 = auVar89._4_4_;
            fVar144 = auVar89._8_4_;
            fVar145 = auVar89._12_4_;
            fVar146 = auVar89._16_4_;
            fVar164 = auVar89._20_4_;
            fVar165 = auVar89._24_4_;
            auVar52._4_4_ = fVar132 * fVar132 * fVar132 * auVar184._4_4_ * -0.5;
            auVar52._0_4_ = fVar160 * fVar160 * fVar160 * auVar184._0_4_ * -0.5;
            auVar52._8_4_ = fVar144 * fVar144 * fVar144 * auVar184._8_4_ * -0.5;
            auVar52._12_4_ = fVar145 * fVar145 * fVar145 * auVar184._12_4_ * -0.5;
            auVar52._16_4_ = fVar146 * fVar146 * fVar146 * -0.0;
            auVar52._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
            auVar52._24_4_ = fVar165 * fVar165 * fVar165 * -0.0;
            auVar52._28_4_ = auVar117._28_4_;
            auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar89 = vfmadd231ps_avx512vl(auVar52,auVar90,auVar89);
            auVar53._4_4_ = auVar117._4_4_ * auVar89._4_4_;
            auVar53._0_4_ = auVar117._0_4_ * auVar89._0_4_;
            auVar53._8_4_ = auVar117._8_4_ * auVar89._8_4_;
            auVar53._12_4_ = auVar117._12_4_ * auVar89._12_4_;
            auVar53._16_4_ = auVar117._16_4_ * auVar89._16_4_;
            auVar53._20_4_ = auVar117._20_4_ * auVar89._20_4_;
            auVar53._24_4_ = auVar117._24_4_ * auVar89._24_4_;
            auVar53._28_4_ = 0;
            auVar54._4_4_ = auVar89._4_4_ * -auVar116._4_4_;
            auVar54._0_4_ = auVar89._0_4_ * -auVar116._0_4_;
            auVar54._8_4_ = auVar89._8_4_ * -auVar116._8_4_;
            auVar54._12_4_ = auVar89._12_4_ * -auVar116._12_4_;
            auVar54._16_4_ = auVar89._16_4_ * -auVar116._16_4_;
            auVar54._20_4_ = auVar89._20_4_ * -auVar116._20_4_;
            auVar54._24_4_ = auVar89._24_4_ * -auVar116._24_4_;
            auVar54._28_4_ = auVar117._28_4_;
            auVar91 = vmulps_avx512vl(auVar89,auVar87);
            auVar89 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar87);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar119,auVar119);
            auVar101 = vrsqrt14ps_avx512vl(auVar89);
            auVar89 = vmulps_avx512vl(auVar89,auVar182);
            fVar160 = auVar101._0_4_;
            fVar132 = auVar101._4_4_;
            fVar144 = auVar101._8_4_;
            fVar145 = auVar101._12_4_;
            fVar146 = auVar101._16_4_;
            fVar164 = auVar101._20_4_;
            fVar165 = auVar101._24_4_;
            auVar55._4_4_ = fVar132 * fVar132 * fVar132 * auVar89._4_4_;
            auVar55._0_4_ = fVar160 * fVar160 * fVar160 * auVar89._0_4_;
            auVar55._8_4_ = fVar144 * fVar144 * fVar144 * auVar89._8_4_;
            auVar55._12_4_ = fVar145 * fVar145 * fVar145 * auVar89._12_4_;
            auVar55._16_4_ = fVar146 * fVar146 * fVar146 * auVar89._16_4_;
            auVar55._20_4_ = fVar164 * fVar164 * fVar164 * auVar89._20_4_;
            auVar55._24_4_ = fVar165 * fVar165 * fVar165 * auVar89._24_4_;
            auVar55._28_4_ = auVar89._28_4_;
            auVar89 = vfmadd231ps_avx512vl(auVar55,auVar90,auVar101);
            auVar56._4_4_ = auVar119._4_4_ * auVar89._4_4_;
            auVar56._0_4_ = auVar119._0_4_ * auVar89._0_4_;
            auVar56._8_4_ = auVar119._8_4_ * auVar89._8_4_;
            auVar56._12_4_ = auVar119._12_4_ * auVar89._12_4_;
            auVar56._16_4_ = auVar119._16_4_ * auVar89._16_4_;
            auVar56._20_4_ = auVar119._20_4_ * auVar89._20_4_;
            auVar56._24_4_ = auVar119._24_4_ * auVar89._24_4_;
            auVar56._28_4_ = auVar101._28_4_;
            auVar57._4_4_ = auVar89._4_4_ * auVar92._4_4_;
            auVar57._0_4_ = auVar89._0_4_ * auVar92._0_4_;
            auVar57._8_4_ = auVar89._8_4_ * auVar92._8_4_;
            auVar57._12_4_ = auVar89._12_4_ * auVar92._12_4_;
            auVar57._16_4_ = auVar89._16_4_ * auVar92._16_4_;
            auVar57._20_4_ = auVar89._20_4_ * auVar92._20_4_;
            auVar57._24_4_ = auVar89._24_4_ * auVar92._24_4_;
            auVar57._28_4_ = auVar92._28_4_;
            auVar92 = vmulps_avx512vl(auVar89,auVar87);
            auVar184 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar82),ZEXT1632(auVar83));
            auVar89 = ZEXT1632(auVar82);
            auVar11 = vfmadd213ps_fma(auVar54,auVar89,ZEXT1632(auVar79));
            auVar90 = vfmadd213ps_avx512vl(auVar91,auVar89,auVar93);
            auVar101 = vfmadd213ps_avx512vl(auVar56,ZEXT1632(auVar10),auVar88);
            auVar80 = vfnmadd213ps_fma(auVar53,auVar89,ZEXT1632(auVar83));
            auVar100 = ZEXT1632(auVar10);
            auVar83 = vfmadd213ps_fma(auVar57,auVar100,auVar97);
            auVar85 = vfnmadd213ps_fma(auVar54,auVar89,ZEXT1632(auVar79));
            auVar79 = vfmadd213ps_fma(auVar92,auVar100,auVar94);
            auVar98 = ZEXT1632(auVar82);
            auVar161 = vfnmadd231ps_fma(auVar93,auVar98,auVar91);
            auVar81 = vfnmadd213ps_fma(auVar56,auVar100,auVar88);
            auVar84 = vfnmadd213ps_fma(auVar57,auVar100,auVar97);
            auVar162 = vfnmadd231ps_fma(auVar94,ZEXT1632(auVar10),auVar92);
            auVar94 = vsubps_avx512vl(auVar101,ZEXT1632(auVar80));
            auVar92 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar85));
            auVar89 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar161));
            auVar58._4_4_ = auVar92._4_4_ * auVar161._4_4_;
            auVar58._0_4_ = auVar92._0_4_ * auVar161._0_4_;
            auVar58._8_4_ = auVar92._8_4_ * auVar161._8_4_;
            auVar58._12_4_ = auVar92._12_4_ * auVar161._12_4_;
            auVar58._16_4_ = auVar92._16_4_ * 0.0;
            auVar58._20_4_ = auVar92._20_4_ * 0.0;
            auVar58._24_4_ = auVar92._24_4_ * 0.0;
            auVar58._28_4_ = auVar91._28_4_;
            auVar82 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar85),auVar89);
            auVar59._4_4_ = auVar89._4_4_ * auVar80._4_4_;
            auVar59._0_4_ = auVar89._0_4_ * auVar80._0_4_;
            auVar59._8_4_ = auVar89._8_4_ * auVar80._8_4_;
            auVar59._12_4_ = auVar89._12_4_ * auVar80._12_4_;
            auVar59._16_4_ = auVar89._16_4_ * 0.0;
            auVar59._20_4_ = auVar89._20_4_ * 0.0;
            auVar59._24_4_ = auVar89._24_4_ * 0.0;
            auVar59._28_4_ = auVar89._28_4_;
            auVar12 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar161),auVar94);
            auVar60._4_4_ = auVar85._4_4_ * auVar94._4_4_;
            auVar60._0_4_ = auVar85._0_4_ * auVar94._0_4_;
            auVar60._8_4_ = auVar85._8_4_ * auVar94._8_4_;
            auVar60._12_4_ = auVar85._12_4_ * auVar94._12_4_;
            auVar60._16_4_ = auVar94._16_4_ * 0.0;
            auVar60._20_4_ = auVar94._20_4_ * 0.0;
            auVar60._24_4_ = auVar94._24_4_ * 0.0;
            auVar60._28_4_ = auVar94._28_4_;
            auVar13 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar80),auVar92);
            auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar13),auVar87,ZEXT1632(auVar12));
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar87,ZEXT1632(auVar82));
            uVar72 = vcmpps_avx512vl(auVar92,auVar87,2);
            bVar70 = (byte)uVar72;
            fVar167 = (float)((uint)(bVar70 & 1) * auVar184._0_4_ |
                             (uint)!(bool)(bVar70 & 1) * auVar81._0_4_);
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            fVar126 = (float)((uint)bVar18 * auVar184._4_4_ | (uint)!bVar18 * auVar81._4_4_);
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            fVar128 = (float)((uint)bVar18 * auVar184._8_4_ | (uint)!bVar18 * auVar81._8_4_);
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            fVar130 = (float)((uint)bVar18 * auVar184._12_4_ | (uint)!bVar18 * auVar81._12_4_);
            auVar100 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar128,CONCAT44(fVar126,fVar167))));
            fVar168 = (float)((uint)(bVar70 & 1) * auVar11._0_4_ |
                             (uint)!(bool)(bVar70 & 1) * auVar84._0_4_);
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            fVar127 = (float)((uint)bVar18 * auVar11._4_4_ | (uint)!bVar18 * auVar84._4_4_);
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            fVar129 = (float)((uint)bVar18 * auVar11._8_4_ | (uint)!bVar18 * auVar84._8_4_);
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            fVar131 = (float)((uint)bVar18 * auVar11._12_4_ | (uint)!bVar18 * auVar84._12_4_);
            auVar95 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(fVar127,fVar168))));
            auVar120._0_4_ =
                 (float)((uint)(bVar70 & 1) * auVar90._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar162._0_4_);
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar120._4_4_ = (float)((uint)bVar18 * auVar90._4_4_ | (uint)!bVar18 * auVar162._4_4_);
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar120._8_4_ = (float)((uint)bVar18 * auVar90._8_4_ | (uint)!bVar18 * auVar162._8_4_);
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar120._12_4_ =
                 (float)((uint)bVar18 * auVar90._12_4_ | (uint)!bVar18 * auVar162._12_4_);
            fVar144 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar90._16_4_);
            auVar120._16_4_ = fVar144;
            fVar132 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar90._20_4_);
            auVar120._20_4_ = fVar132;
            fVar160 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar90._24_4_);
            auVar120._24_4_ = fVar160;
            iVar1 = (uint)(byte)(uVar72 >> 7) * auVar90._28_4_;
            auVar120._28_4_ = iVar1;
            auVar92 = vblendmps_avx512vl(ZEXT1632(auVar80),auVar101);
            auVar121._0_4_ =
                 (uint)(bVar70 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar82._0_4_;
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar121._4_4_ = (uint)bVar18 * auVar92._4_4_ | (uint)!bVar18 * auVar82._4_4_;
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar121._8_4_ = (uint)bVar18 * auVar92._8_4_ | (uint)!bVar18 * auVar82._8_4_;
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar121._12_4_ = (uint)bVar18 * auVar92._12_4_ | (uint)!bVar18 * auVar82._12_4_;
            auVar121._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar92._16_4_;
            auVar121._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar92._20_4_;
            auVar121._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar92._24_4_;
            auVar121._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar92._28_4_;
            auVar92 = vblendmps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar83));
            auVar122._0_4_ =
                 (float)((uint)(bVar70 & 1) * auVar92._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar184._0_4_);
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar122._4_4_ = (float)((uint)bVar18 * auVar92._4_4_ | (uint)!bVar18 * auVar184._4_4_);
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar122._8_4_ = (float)((uint)bVar18 * auVar92._8_4_ | (uint)!bVar18 * auVar184._8_4_);
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar122._12_4_ =
                 (float)((uint)bVar18 * auVar92._12_4_ | (uint)!bVar18 * auVar184._12_4_);
            fVar146 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar92._16_4_);
            auVar122._16_4_ = fVar146;
            fVar164 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar92._20_4_);
            auVar122._20_4_ = fVar164;
            fVar145 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar92._24_4_);
            auVar122._24_4_ = fVar145;
            auVar122._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar92._28_4_;
            auVar92 = vblendmps_avx512vl(ZEXT1632(auVar161),ZEXT1632(auVar79));
            auVar123._0_4_ =
                 (float)((uint)(bVar70 & 1) * auVar92._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar11._0_4_);
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar123._4_4_ = (float)((uint)bVar18 * auVar92._4_4_ | (uint)!bVar18 * auVar11._4_4_);
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar123._8_4_ = (float)((uint)bVar18 * auVar92._8_4_ | (uint)!bVar18 * auVar11._8_4_);
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar123._12_4_ =
                 (float)((uint)bVar18 * auVar92._12_4_ | (uint)!bVar18 * auVar11._12_4_);
            fVar165 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar92._16_4_);
            auVar123._16_4_ = fVar165;
            fVar166 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar92._20_4_);
            auVar123._20_4_ = fVar166;
            fVar147 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar92._24_4_);
            auVar123._24_4_ = fVar147;
            iVar2 = (uint)(byte)(uVar72 >> 7) * auVar92._28_4_;
            auVar123._28_4_ = iVar2;
            auVar124._0_4_ =
                 (uint)(bVar70 & 1) * (int)auVar80._0_4_ |
                 (uint)!(bool)(bVar70 & 1) * auVar101._0_4_;
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar124._4_4_ = (uint)bVar18 * (int)auVar80._4_4_ | (uint)!bVar18 * auVar101._4_4_;
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar124._8_4_ = (uint)bVar18 * (int)auVar80._8_4_ | (uint)!bVar18 * auVar101._8_4_;
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar124._12_4_ = (uint)bVar18 * (int)auVar80._12_4_ | (uint)!bVar18 * auVar101._12_4_;
            auVar124._16_4_ = (uint)!(bool)((byte)(uVar72 >> 4) & 1) * auVar101._16_4_;
            auVar124._20_4_ = (uint)!(bool)((byte)(uVar72 >> 5) & 1) * auVar101._20_4_;
            auVar124._24_4_ = (uint)!(bool)((byte)(uVar72 >> 6) & 1) * auVar101._24_4_;
            auVar124._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar101._28_4_;
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar72 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar72 >> 3) & 1);
            bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
            bVar21 = (bool)((byte)(uVar72 >> 2) & 1);
            bVar23 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar101 = vsubps_avx512vl(auVar124,auVar100);
            auVar89 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar85._12_4_ |
                                                    (uint)!bVar22 * auVar83._12_4_,
                                                    CONCAT48((uint)bVar20 * (int)auVar85._8_4_ |
                                                             (uint)!bVar20 * auVar83._8_4_,
                                                             CONCAT44((uint)bVar18 *
                                                                      (int)auVar85._4_4_ |
                                                                      (uint)!bVar18 * auVar83._4_4_,
                                                                      (uint)(bVar70 & 1) *
                                                                      (int)auVar85._0_4_ |
                                                                      (uint)!(bool)(bVar70 & 1) *
                                                                      auVar83._0_4_)))),auVar95);
            auVar90 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar161._12_4_ |
                                                    (uint)!bVar23 * auVar79._12_4_,
                                                    CONCAT48((uint)bVar21 * (int)auVar161._8_4_ |
                                                             (uint)!bVar21 * auVar79._8_4_,
                                                             CONCAT44((uint)bVar19 *
                                                                      (int)auVar161._4_4_ |
                                                                      (uint)!bVar19 * auVar79._4_4_,
                                                                      (uint)(bVar70 & 1) *
                                                                      (int)auVar161._0_4_ |
                                                                      (uint)!(bool)(bVar70 & 1) *
                                                                      auVar79._0_4_)))),auVar120);
            auVar91 = vsubps_avx(auVar100,auVar121);
            auVar94 = vsubps_avx(auVar95,auVar122);
            auVar93 = vsubps_avx(auVar120,auVar123);
            auVar61._4_4_ = auVar90._4_4_ * fVar126;
            auVar61._0_4_ = auVar90._0_4_ * fVar167;
            auVar61._8_4_ = auVar90._8_4_ * fVar128;
            auVar61._12_4_ = auVar90._12_4_ * fVar130;
            auVar61._16_4_ = auVar90._16_4_ * 0.0;
            auVar61._20_4_ = auVar90._20_4_ * 0.0;
            auVar61._24_4_ = auVar90._24_4_ * 0.0;
            auVar61._28_4_ = 0;
            auVar82 = vfmsub231ps_fma(auVar61,auVar120,auVar101);
            auVar153._0_4_ = fVar168 * auVar101._0_4_;
            auVar153._4_4_ = fVar127 * auVar101._4_4_;
            auVar153._8_4_ = fVar129 * auVar101._8_4_;
            auVar153._12_4_ = fVar131 * auVar101._12_4_;
            auVar153._16_4_ = auVar101._16_4_ * 0.0;
            auVar153._20_4_ = auVar101._20_4_ * 0.0;
            auVar153._24_4_ = auVar101._24_4_ * 0.0;
            auVar153._28_4_ = 0;
            auVar83 = vfmsub231ps_fma(auVar153,auVar100,auVar89);
            auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar87,ZEXT1632(auVar82));
            auVar156._0_4_ = auVar89._0_4_ * auVar120._0_4_;
            auVar156._4_4_ = auVar89._4_4_ * auVar120._4_4_;
            auVar156._8_4_ = auVar89._8_4_ * auVar120._8_4_;
            auVar156._12_4_ = auVar89._12_4_ * auVar120._12_4_;
            auVar156._16_4_ = auVar89._16_4_ * fVar144;
            auVar156._20_4_ = auVar89._20_4_ * fVar132;
            auVar156._24_4_ = auVar89._24_4_ * fVar160;
            auVar156._28_4_ = 0;
            auVar82 = vfmsub231ps_fma(auVar156,auVar95,auVar90);
            auVar96 = vfmadd231ps_avx512vl(auVar92,auVar87,ZEXT1632(auVar82));
            auVar92 = vmulps_avx512vl(auVar93,auVar121);
            auVar92 = vfmsub231ps_avx512vl(auVar92,auVar91,auVar123);
            auVar62._4_4_ = auVar94._4_4_ * auVar123._4_4_;
            auVar62._0_4_ = auVar94._0_4_ * auVar123._0_4_;
            auVar62._8_4_ = auVar94._8_4_ * auVar123._8_4_;
            auVar62._12_4_ = auVar94._12_4_ * auVar123._12_4_;
            auVar62._16_4_ = auVar94._16_4_ * fVar165;
            auVar62._20_4_ = auVar94._20_4_ * fVar166;
            auVar62._24_4_ = auVar94._24_4_ * fVar147;
            auVar62._28_4_ = iVar2;
            auVar82 = vfmsub231ps_fma(auVar62,auVar122,auVar93);
            auVar157._0_4_ = auVar122._0_4_ * auVar91._0_4_;
            auVar157._4_4_ = auVar122._4_4_ * auVar91._4_4_;
            auVar157._8_4_ = auVar122._8_4_ * auVar91._8_4_;
            auVar157._12_4_ = auVar122._12_4_ * auVar91._12_4_;
            auVar157._16_4_ = fVar146 * auVar91._16_4_;
            auVar157._20_4_ = fVar164 * auVar91._20_4_;
            auVar157._24_4_ = fVar145 * auVar91._24_4_;
            auVar157._28_4_ = 0;
            auVar83 = vfmsub231ps_fma(auVar157,auVar94,auVar121);
            auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar87,auVar92);
            auVar88 = vfmadd231ps_avx512vl(auVar92,auVar87,ZEXT1632(auVar82));
            auVar92 = vmaxps_avx(auVar96,auVar88);
            uVar140 = vcmpps_avx512vl(auVar92,auVar87,2);
            bVar78 = bVar78 & (byte)uVar140;
            if (bVar78 != 0) {
              auVar63._4_4_ = auVar93._4_4_ * auVar89._4_4_;
              auVar63._0_4_ = auVar93._0_4_ * auVar89._0_4_;
              auVar63._8_4_ = auVar93._8_4_ * auVar89._8_4_;
              auVar63._12_4_ = auVar93._12_4_ * auVar89._12_4_;
              auVar63._16_4_ = auVar93._16_4_ * auVar89._16_4_;
              auVar63._20_4_ = auVar93._20_4_ * auVar89._20_4_;
              auVar63._24_4_ = auVar93._24_4_ * auVar89._24_4_;
              auVar63._28_4_ = auVar92._28_4_;
              auVar79 = vfmsub231ps_fma(auVar63,auVar94,auVar90);
              auVar64._4_4_ = auVar90._4_4_ * auVar91._4_4_;
              auVar64._0_4_ = auVar90._0_4_ * auVar91._0_4_;
              auVar64._8_4_ = auVar90._8_4_ * auVar91._8_4_;
              auVar64._12_4_ = auVar90._12_4_ * auVar91._12_4_;
              auVar64._16_4_ = auVar90._16_4_ * auVar91._16_4_;
              auVar64._20_4_ = auVar90._20_4_ * auVar91._20_4_;
              auVar64._24_4_ = auVar90._24_4_ * auVar91._24_4_;
              auVar64._28_4_ = auVar90._28_4_;
              auVar83 = vfmsub231ps_fma(auVar64,auVar101,auVar93);
              auVar65._4_4_ = auVar94._4_4_ * auVar101._4_4_;
              auVar65._0_4_ = auVar94._0_4_ * auVar101._0_4_;
              auVar65._8_4_ = auVar94._8_4_ * auVar101._8_4_;
              auVar65._12_4_ = auVar94._12_4_ * auVar101._12_4_;
              auVar65._16_4_ = auVar94._16_4_ * auVar101._16_4_;
              auVar65._20_4_ = auVar94._20_4_ * auVar101._20_4_;
              auVar65._24_4_ = auVar94._24_4_ * auVar101._24_4_;
              auVar65._28_4_ = auVar94._28_4_;
              auVar184 = vfmsub231ps_fma(auVar65,auVar91,auVar89);
              auVar82 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar83),ZEXT1632(auVar184));
              auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar79),auVar87);
              auVar89 = vrcp14ps_avx512vl(auVar92);
              auVar91 = auVar186._0_32_;
              auVar90 = vfnmadd213ps_avx512vl(auVar89,auVar92,auVar91);
              auVar82 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
              auVar66._4_4_ = auVar184._4_4_ * auVar120._4_4_;
              auVar66._0_4_ = auVar184._0_4_ * auVar120._0_4_;
              auVar66._8_4_ = auVar184._8_4_ * auVar120._8_4_;
              auVar66._12_4_ = auVar184._12_4_ * auVar120._12_4_;
              auVar66._16_4_ = fVar144 * 0.0;
              auVar66._20_4_ = fVar132 * 0.0;
              auVar66._24_4_ = fVar160 * 0.0;
              auVar66._28_4_ = iVar1;
              auVar83 = vfmadd231ps_fma(auVar66,auVar95,ZEXT1632(auVar83));
              auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar100,ZEXT1632(auVar79));
              fVar132 = auVar82._0_4_;
              fVar144 = auVar82._4_4_;
              fVar145 = auVar82._8_4_;
              fVar146 = auVar82._12_4_;
              local_220 = ZEXT1632(CONCAT412(auVar83._12_4_ * fVar146,
                                             CONCAT48(auVar83._8_4_ * fVar145,
                                                      CONCAT44(auVar83._4_4_ * fVar144,
                                                               auVar83._0_4_ * fVar132))));
              uVar140 = vcmpps_avx512vl(local_220,local_2e0,0xd);
              fVar160 = local_540->tfar;
              auVar30._4_4_ = fVar160;
              auVar30._0_4_ = fVar160;
              auVar30._8_4_ = fVar160;
              auVar30._12_4_ = fVar160;
              auVar30._16_4_ = fVar160;
              auVar30._20_4_ = fVar160;
              auVar30._24_4_ = fVar160;
              auVar30._28_4_ = fVar160;
              uVar24 = vcmpps_avx512vl(local_220,auVar30,2);
              bVar78 = (byte)uVar140 & (byte)uVar24 & bVar78;
              if (bVar78 != 0) {
                uVar140 = vcmpps_avx512vl(auVar92,auVar87,4);
                bVar78 = bVar78 & (byte)uVar140;
                auVar179 = ZEXT3264(local_360);
                auVar183 = ZEXT3264(local_380);
                if (bVar78 != 0) {
                  fVar160 = auVar96._0_4_ * fVar132;
                  fVar164 = auVar96._4_4_ * fVar144;
                  auVar67._4_4_ = fVar164;
                  auVar67._0_4_ = fVar160;
                  fVar165 = auVar96._8_4_ * fVar145;
                  auVar67._8_4_ = fVar165;
                  fVar166 = auVar96._12_4_ * fVar146;
                  auVar67._12_4_ = fVar166;
                  fVar147 = auVar96._16_4_ * 0.0;
                  auVar67._16_4_ = fVar147;
                  fVar167 = auVar96._20_4_ * 0.0;
                  auVar67._20_4_ = fVar167;
                  fVar168 = auVar96._24_4_ * 0.0;
                  auVar67._24_4_ = fVar168;
                  auVar67._28_4_ = auVar92._28_4_;
                  auVar89 = vsubps_avx512vl(auVar91,auVar67);
                  local_260._0_4_ =
                       (float)((uint)(bVar70 & 1) * (int)fVar160 |
                              (uint)!(bool)(bVar70 & 1) * auVar89._0_4_);
                  bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
                  local_260._4_4_ =
                       (float)((uint)bVar18 * (int)fVar164 | (uint)!bVar18 * auVar89._4_4_);
                  bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
                  local_260._8_4_ =
                       (float)((uint)bVar18 * (int)fVar165 | (uint)!bVar18 * auVar89._8_4_);
                  bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
                  local_260._12_4_ =
                       (float)((uint)bVar18 * (int)fVar166 | (uint)!bVar18 * auVar89._12_4_);
                  bVar18 = (bool)((byte)(uVar72 >> 4) & 1);
                  local_260._16_4_ =
                       (float)((uint)bVar18 * (int)fVar147 | (uint)!bVar18 * auVar89._16_4_);
                  bVar18 = (bool)((byte)(uVar72 >> 5) & 1);
                  local_260._20_4_ =
                       (float)((uint)bVar18 * (int)fVar167 | (uint)!bVar18 * auVar89._20_4_);
                  bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
                  local_260._24_4_ =
                       (float)((uint)bVar18 * (int)fVar168 | (uint)!bVar18 * auVar89._24_4_);
                  bVar18 = SUB81(uVar72 >> 7,0);
                  local_260._28_4_ =
                       (float)((uint)bVar18 * auVar92._28_4_ | (uint)!bVar18 * auVar89._28_4_);
                  auVar92 = vsubps_avx(ZEXT1632(auVar10),auVar98);
                  auVar82 = vfmadd213ps_fma(auVar92,local_260,auVar98);
                  fVar160 = local_528->depth_scale;
                  auVar31._4_4_ = fVar160;
                  auVar31._0_4_ = fVar160;
                  auVar31._8_4_ = fVar160;
                  auVar31._12_4_ = fVar160;
                  auVar31._16_4_ = fVar160;
                  auVar31._20_4_ = fVar160;
                  auVar31._24_4_ = fVar160;
                  auVar31._28_4_ = fVar160;
                  auVar92 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                                               CONCAT48(auVar82._8_4_ +
                                                                        auVar82._8_4_,
                                                                        CONCAT44(auVar82._4_4_ +
                                                                                 auVar82._4_4_,
                                                                                 auVar82._0_4_ +
                                                                                 auVar82._0_4_)))),
                                            auVar31);
                  uVar140 = vcmpps_avx512vl(local_220,auVar92,6);
                  if (((byte)uVar140 & bVar78) != 0) {
                    auVar9._0_4_ = local_540->tfar;
                    auVar9._4_4_ = local_540->mask;
                    auVar9._8_4_ = local_540->id;
                    auVar9._12_4_ = local_540->flags;
                    uVar71 = vextractps_avx(auVar9,1);
                    auVar139._0_4_ = auVar88._0_4_ * fVar132;
                    auVar139._4_4_ = auVar88._4_4_ * fVar144;
                    auVar139._8_4_ = auVar88._8_4_ * fVar145;
                    auVar139._12_4_ = auVar88._12_4_ * fVar146;
                    auVar139._16_4_ = auVar88._16_4_ * 0.0;
                    auVar139._20_4_ = auVar88._20_4_ * 0.0;
                    auVar139._24_4_ = auVar88._24_4_ * 0.0;
                    auVar139._28_4_ = 0;
                    auVar92 = vsubps_avx512vl(auVar91,auVar139);
                    auVar125._0_4_ =
                         (uint)(bVar70 & 1) * (int)auVar139._0_4_ |
                         (uint)!(bool)(bVar70 & 1) * auVar92._0_4_;
                    bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
                    auVar125._4_4_ =
                         (uint)bVar18 * (int)auVar139._4_4_ | (uint)!bVar18 * auVar92._4_4_;
                    bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
                    auVar125._8_4_ =
                         (uint)bVar18 * (int)auVar139._8_4_ | (uint)!bVar18 * auVar92._8_4_;
                    bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
                    auVar125._12_4_ =
                         (uint)bVar18 * (int)auVar139._12_4_ | (uint)!bVar18 * auVar92._12_4_;
                    bVar18 = (bool)((byte)(uVar72 >> 4) & 1);
                    auVar125._16_4_ =
                         (uint)bVar18 * (int)auVar139._16_4_ | (uint)!bVar18 * auVar92._16_4_;
                    bVar18 = (bool)((byte)(uVar72 >> 5) & 1);
                    auVar125._20_4_ =
                         (uint)bVar18 * (int)auVar139._20_4_ | (uint)!bVar18 * auVar92._20_4_;
                    bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
                    auVar125._24_4_ =
                         (uint)bVar18 * (int)auVar139._24_4_ | (uint)!bVar18 * auVar92._24_4_;
                    auVar125._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar92._28_4_;
                    auVar32._8_4_ = 0x40000000;
                    auVar32._0_8_ = 0x4000000040000000;
                    auVar32._12_4_ = 0x40000000;
                    auVar32._16_4_ = 0x40000000;
                    auVar32._20_4_ = 0x40000000;
                    auVar32._24_4_ = 0x40000000;
                    auVar32._28_4_ = 0x40000000;
                    local_240 = vfmsub132ps_avx512vl(auVar125,auVar91,auVar32);
                    local_200 = (int)lVar74;
                    local_1fc = iVar15;
                    local_1f0 = local_470;
                    local_1e0 = local_480;
                    local_1d0 = local_520;
                    uStack_1c8 = uStack_518;
                    pGVar16 = (context->scene->geometries).items[local_530].ptr;
                    if ((pGVar16->mask & uVar71) == 0) {
                      bVar70 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar70 = 1, pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar82 = vcvtsi2ss_avx512f(auVar86._0_16_,(int)lVar74);
                      fVar160 = auVar82._0_4_;
                      local_1a0[0] = (fVar160 + local_260._0_4_ + 0.0) * (float)local_300._0_4_;
                      local_1a0[1] = (fVar160 + local_260._4_4_ + 1.0) * (float)local_300._4_4_;
                      local_1a0[2] = (fVar160 + local_260._8_4_ + 2.0) * fStack_2f8;
                      local_1a0[3] = (fVar160 + local_260._12_4_ + 3.0) * fStack_2f4;
                      fStack_190 = (fVar160 + local_260._16_4_ + 4.0) * fStack_2f0;
                      fStack_18c = (fVar160 + local_260._20_4_ + 5.0) * fStack_2ec;
                      fStack_188 = (fVar160 + local_260._24_4_ + 6.0) * fStack_2e8;
                      fStack_184 = fVar160 + local_260._28_4_ + 7.0;
                      local_180 = local_240;
                      local_160 = local_220;
                      uVar72 = CONCAT71(0,(byte)uVar140 & bVar78);
                      local_4e0._0_8_ = uVar72;
                      lVar73 = 0;
                      for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
                        lVar73 = lVar73 + 1;
                      }
                      local_490 = context;
                      local_270 = auVar9;
                      local_498 = pGVar16;
                      do {
                        auVar184 = auVar185._0_16_;
                        local_4c4 = local_1a0[lVar73];
                        local_4c0 = *(undefined4 *)(local_180 + lVar73 * 4);
                        local_460._0_8_ = lVar73;
                        local_540->tfar = *(float *)(local_160 + lVar73 * 4);
                        local_510.context = local_490->user;
                        fVar160 = 1.0 - local_4c4;
                        auVar10 = vfnmadd231ss_fma(ZEXT416((uint)(local_4c4 * (fVar160 + fVar160))),
                                                   ZEXT416((uint)fVar160),ZEXT416((uint)fVar160));
                        auVar79 = ZEXT416((uint)local_4c4);
                        auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar79,
                                                  ZEXT416(0xc0a00000));
                        auVar83 = vfmadd231ss_fma(ZEXT416((uint)(local_4c4 * local_4c4 * 3.0)),
                                                  ZEXT416((uint)(local_4c4 + local_4c4)),auVar82);
                        auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar79,
                                                  ZEXT416(0x40000000));
                        auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160 * -3.0)),
                                                  ZEXT416((uint)(fVar160 + fVar160)),auVar82);
                        auVar79 = vfmadd231ss_fma(ZEXT416((uint)(local_4c4 * local_4c4)),auVar79,
                                                  ZEXT416((uint)(fVar160 * -2.0)));
                        fVar160 = auVar10._0_4_ * 0.5;
                        fVar132 = auVar83._0_4_ * 0.5;
                        fVar144 = auVar82._0_4_ * 0.5;
                        fVar145 = auVar79._0_4_ * 0.5;
                        auVar150._0_4_ = fVar145 * local_450;
                        auVar150._4_4_ = fVar145 * fStack_44c;
                        auVar150._8_4_ = fVar145 * fStack_448;
                        auVar150._12_4_ = fVar145 * fStack_444;
                        auVar159._4_4_ = fVar144;
                        auVar159._0_4_ = fVar144;
                        auVar159._8_4_ = fVar144;
                        auVar159._12_4_ = fVar144;
                        auVar69._8_8_ = uStack_518;
                        auVar69._0_8_ = local_520;
                        auVar82 = vfmadd132ps_fma(auVar159,auVar150,auVar69);
                        auVar151._4_4_ = fVar132;
                        auVar151._0_4_ = fVar132;
                        auVar151._8_4_ = fVar132;
                        auVar151._12_4_ = fVar132;
                        auVar82 = vfmadd213ps_fma(auVar151,local_480,auVar82);
                        auVar142._4_4_ = fVar160;
                        auVar142._0_4_ = fVar160;
                        auVar142._8_4_ = fVar160;
                        auVar142._12_4_ = fVar160;
                        auVar82 = vfmadd213ps_fma(auVar142,local_470,auVar82);
                        local_4d0 = vmovlps_avx(auVar82);
                        local_4c8 = vextractps_avx(auVar82,2);
                        local_4bc = (int)local_488;
                        local_4b8 = (int)local_530;
                        local_4b4 = (local_510.context)->instID[0];
                        local_4b0 = (local_510.context)->instPrimID[0];
                        local_544 = -1;
                        local_510.valid = &local_544;
                        local_510.geometryUserPtr = local_498->userPtr;
                        local_510.ray = (RTCRayN *)local_540;
                        local_510.hit = (RTCHitN *)&local_4d0;
                        local_510.N = 1;
                        if ((local_498->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*local_498->occlusionFilterN)(&local_510), *local_510.valid != 0)) {
                          p_Var17 = local_490->args->filter;
                          if ((p_Var17 == (RTCFilterFunctionN)0x0) ||
                             ((((local_490->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                == RTC_RAY_QUERY_FLAG_INCOHERENT &&
                               (((local_498->field_8).field_0x2 & 0x40) == 0)) ||
                              ((*p_Var17)(&local_510), *local_510.valid != 0)))) {
                            bVar70 = 1;
                            auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar186 = ZEXT3264(auVar92);
                            auVar82 = vxorps_avx512vl(auVar184,auVar184);
                            auVar185 = ZEXT1664(auVar82);
                            auVar179 = ZEXT3264(local_360);
                            auVar183 = ZEXT3264(local_380);
                            auVar189 = ZEXT3264(local_3e0);
                            auVar191 = ZEXT3264(local_3a0);
                            auVar187 = ZEXT3264(local_400);
                            auVar190 = ZEXT3264(local_420);
                            auVar188 = ZEXT3264(local_3c0);
                            auVar192 = ZEXT3264(local_440);
                            context = local_490;
                            break;
                          }
                        }
                        local_540->tfar = (float)local_270._0_4_;
                        uVar75 = local_4e0._0_8_ ^ 1L << (local_460._0_8_ & 0x3f);
                        bVar70 = 0;
                        local_4e0._0_8_ = uVar75;
                        lVar73 = 0;
                        for (uVar72 = uVar75; (uVar72 & 1) == 0;
                            uVar72 = uVar72 >> 1 | 0x8000000000000000) {
                          lVar73 = lVar73 + 1;
                        }
                        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar186 = ZEXT3264(auVar92);
                        auVar82 = vxorps_avx512vl(auVar184,auVar184);
                        auVar185 = ZEXT1664(auVar82);
                        auVar179 = ZEXT3264(local_360);
                        auVar183 = ZEXT3264(local_380);
                        auVar189 = ZEXT3264(local_3e0);
                        auVar191 = ZEXT3264(local_3a0);
                        auVar187 = ZEXT3264(local_400);
                        auVar190 = ZEXT3264(local_420);
                        auVar188 = ZEXT3264(local_3c0);
                        auVar192 = ZEXT3264(local_440);
                        context = local_490;
                      } while (uVar75 != 0);
                    }
                    bVar76 = (bool)(bVar76 | bVar70);
                  }
                }
                goto LAB_01d23305;
              }
            }
            auVar179 = ZEXT3264(local_360);
            auVar183 = ZEXT3264(local_380);
          }
LAB_01d23305:
          lVar74 = lVar74 + 8;
        } while ((int)lVar74 < iVar15);
      }
      if (bVar76) {
        return bVar76;
      }
      fVar160 = local_540->tfar;
      auVar29._4_4_ = fVar160;
      auVar29._0_4_ = fVar160;
      auVar29._8_4_ = fVar160;
      auVar29._12_4_ = fVar160;
      auVar29._16_4_ = fVar160;
      auVar29._20_4_ = fVar160;
      auVar29._24_4_ = fVar160;
      auVar29._28_4_ = fVar160;
      uVar140 = vcmpps_avx512vl(local_80,auVar29,2);
      uVar71 = (uint)uVar77 & (uint)uVar140;
      uVar77 = (ulong)uVar71;
    } while (uVar71 != 0);
  }
  return bVar76;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }